

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx::SubGridIntersectorKMoeller<8,_8,_true>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  undefined1 auVar5 [32];
  ushort uVar6;
  ushort uVar7;
  Geometry *pGVar8;
  long lVar9;
  RTCFilterFunctionN p_Var10;
  RTCRayQueryContext *pRVar11;
  long lVar12;
  size_t k;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  int iVar91;
  uint uVar92;
  uint uVar93;
  float fVar94;
  ulong uVar95;
  long lVar96;
  long lVar97;
  float *pfVar98;
  ulong uVar99;
  ulong uVar100;
  long lVar101;
  long lVar102;
  undefined1 (*pauVar103) [32];
  ulong *puVar104;
  undefined4 uVar105;
  ulong unaff_R14;
  ulong uVar106;
  NodeRef root;
  bool bVar107;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar117 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar138;
  undefined1 in_ZMM0 [64];
  undefined1 auVar139 [16];
  undefined1 auVar144 [16];
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar140 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar150 [32];
  undefined1 auVar145 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float fVar158;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  float fVar162;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [64];
  undefined1 auVar163 [36];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar164;
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  float fVar185;
  undefined1 auVar173 [32];
  uint uVar182;
  uint uVar184;
  uint uVar186;
  uint uVar188;
  uint uVar190;
  uint uVar192;
  uint uVar193;
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  float fVar181;
  float fVar183;
  float fVar187;
  float fVar189;
  float fVar191;
  undefined1 auVar180 [64];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar194;
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar207;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  undefined1 auVar211 [64];
  float fVar218;
  float fVar219;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar227;
  float fVar228;
  float fVar229;
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  float fVar230;
  undefined1 auVar231 [16];
  float fVar237;
  float fVar238;
  float fVar240;
  float fVar241;
  float fVar242;
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  float fVar239;
  undefined1 auVar236 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  float fVar249;
  float fVar250;
  undefined1 auVar248 [32];
  undefined1 auVar251 [32];
  float fVar252;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  undefined1 auVar253 [32];
  float fVar260;
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar267;
  undefined1 auVar261 [32];
  Precalculations pre;
  vfloat<8> upper_y;
  vfloat<8> lower_y;
  vbool<8> terminated;
  vfloat<8> upper_z;
  vfloat<8> lower_z;
  TravRayK<8,_false> tray;
  vfloat<8> lower_x;
  vfloat<8> upper_x;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_61a1;
  undefined1 local_61a0 [16];
  undefined8 uStack_6190;
  undefined8 uStack_6188;
  undefined1 local_6180 [32];
  undefined1 local_6160 [32];
  undefined1 local_6130 [16];
  undefined1 local_6120 [8];
  float fStack_6118;
  float fStack_6114;
  float fStack_6110;
  float fStack_610c;
  float fStack_6108;
  undefined1 local_6100 [8];
  float fStack_60f8;
  float fStack_60f4;
  float fStack_60f0;
  float fStack_60ec;
  float fStack_60e8;
  float fStack_60e4;
  undefined1 local_60e0 [8];
  float fStack_60d8;
  float fStack_60d4;
  undefined1 auStack_60d0 [8];
  float fStack_60c8;
  float fStack_60c4;
  undefined1 local_60c0 [8];
  undefined8 uStack_60b8;
  undefined8 uStack_60b0;
  undefined8 uStack_60a8;
  RTCHitN *local_60a0;
  uint local_6098;
  float local_6080;
  float fStack_607c;
  float fStack_6078;
  float fStack_6074;
  float fStack_6070;
  float fStack_606c;
  float fStack_6068;
  undefined4 uStack_6064;
  undefined8 local_6060;
  undefined8 uStack_6058;
  undefined8 uStack_6050;
  undefined8 uStack_6048;
  undefined1 local_6040 [32];
  undefined1 local_6020 [32];
  undefined1 local_6000 [32];
  RayK<8> *local_5fd8;
  undefined1 (*local_5fd0) [32];
  ulong local_5fc8;
  undefined8 local_5fc0;
  undefined8 uStack_5fb8;
  undefined8 uStack_5fb0;
  undefined8 uStack_5fa8;
  undefined1 local_5fa0 [8];
  undefined8 uStack_5f98;
  undefined8 uStack_5f90;
  undefined8 uStack_5f88;
  undefined1 local_5f80 [32];
  undefined1 local_5f60 [32];
  undefined1 local_5f40 [20];
  uint uStack_5f2c;
  uint uStack_5f28;
  uint uStack_5f24;
  BVH *local_5f10;
  Intersectors *local_5f08;
  long local_5f00;
  long local_5ef8;
  long local_5ef0;
  ulong local_5ee8;
  undefined1 local_5ee0 [8];
  float fStack_5ed8;
  float fStack_5ed4;
  float fStack_5ed0;
  float fStack_5ecc;
  float fStack_5ec8;
  float fStack_5ec4;
  undefined1 local_5ec0 [32];
  undefined1 local_5ea0 [32];
  float local_5e80;
  float fStack_5e7c;
  float fStack_5e78;
  float fStack_5e74;
  float fStack_5e70;
  float fStack_5e6c;
  float fStack_5e68;
  float fStack_5e64;
  undefined8 local_5e60;
  undefined8 uStack_5e58;
  float fStack_5e50;
  float fStack_5e4c;
  float fStack_5e48;
  float fStack_5e44;
  undefined8 local_5e40;
  undefined8 uStack_5e38;
  float fStack_5e30;
  float fStack_5e2c;
  float fStack_5e28;
  float fStack_5e24;
  undefined1 local_5e20 [32];
  undefined1 local_5e00 [32];
  undefined1 local_5de0 [8];
  float fStack_5dd8;
  float fStack_5dd4;
  float fStack_5dd0;
  float fStack_5dcc;
  float fStack_5dc8;
  float fStack_5dc4;
  undefined1 local_5db0 [16];
  undefined1 local_5da0 [16];
  undefined1 local_5d90 [16];
  undefined1 local_5d80 [32];
  undefined8 local_5d60;
  undefined8 uStack_5d58;
  undefined8 uStack_5d50;
  undefined8 uStack_5d48;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5d40;
  undefined1 local_5ce0 [32];
  undefined1 local_5cc0 [32];
  undefined1 local_5ca0 [32];
  undefined1 local_5c80 [8];
  float fStack_5c78;
  float fStack_5c74;
  float fStack_5c70;
  float fStack_5c6c;
  float fStack_5c68;
  undefined1 local_5c60 [8];
  float fStack_5c58;
  float fStack_5c54;
  float fStack_5c50;
  float fStack_5c4c;
  float fStack_5c48;
  undefined1 local_5c40 [8];
  float fStack_5c38;
  float fStack_5c34;
  float fStack_5c30;
  float fStack_5c2c;
  float fStack_5c28;
  undefined1 local_5c20 [32];
  undefined1 local_5c00 [32];
  undefined1 local_5be0 [32];
  undefined1 local_5bc0 [32];
  undefined1 local_5ba0 [32];
  undefined1 local_5b80 [8];
  undefined8 uStack_5b78;
  undefined8 uStack_5b70;
  undefined8 uStack_5b68;
  undefined1 local_5b60 [8];
  float fStack_5b58;
  float fStack_5b54;
  float fStack_5b50;
  float fStack_5b4c;
  float fStack_5b48;
  float fStack_5b44;
  undefined8 local_5b40;
  undefined8 uStack_5b38;
  undefined8 uStack_5b30;
  undefined8 uStack_5b28;
  float local_5b20;
  float fStack_5b1c;
  float fStack_5b18;
  float fStack_5b14;
  float fStack_5b10;
  float fStack_5b0c;
  float fStack_5b08;
  float fStack_5b04;
  float local_5b00;
  float fStack_5afc;
  float fStack_5af8;
  float fStack_5af4;
  float fStack_5af0;
  float fStack_5aec;
  float fStack_5ae8;
  undefined4 uStack_5ae4;
  undefined1 local_5ae0 [16];
  undefined1 local_5ad0 [16];
  undefined1 local_5ac0 [16];
  undefined1 local_5ab0 [16];
  uint local_5aa0;
  uint uStack_5a9c;
  uint uStack_5a98;
  uint uStack_5a94;
  uint uStack_5a90;
  uint uStack_5a8c;
  uint uStack_5a88;
  uint uStack_5a84;
  uint local_5a80;
  uint uStack_5a7c;
  uint uStack_5a78;
  uint uStack_5a74;
  uint uStack_5a70;
  uint uStack_5a6c;
  uint uStack_5a68;
  uint uStack_5a64;
  undefined8 local_5a60;
  undefined8 uStack_5a58;
  undefined8 uStack_5a50;
  undefined8 uStack_5a48;
  undefined8 local_5a40;
  undefined8 uStack_5a38;
  undefined8 local_5a30;
  undefined8 uStack_5a28;
  undefined8 local_5a20;
  undefined8 uStack_5a18;
  undefined8 local_5a10;
  undefined8 uStack_5a08;
  undefined8 local_5a00;
  undefined8 uStack_59f8;
  undefined8 local_59f0;
  undefined8 uStack_59e8;
  undefined8 local_59e0;
  undefined8 uStack_59d8;
  undefined8 local_59d0;
  undefined8 uStack_59c8;
  undefined8 local_59c0;
  undefined8 uStack_59b8;
  undefined8 local_59b0;
  undefined8 uStack_59a8;
  undefined8 local_59a0;
  undefined8 uStack_5998;
  undefined8 local_5990;
  undefined8 uStack_5988;
  undefined8 local_5980;
  undefined8 uStack_5978;
  undefined8 local_5970;
  undefined8 uStack_5968;
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  undefined1 local_5920 [32];
  float local_5900;
  float fStack_58fc;
  float fStack_58f8;
  float fStack_58f4;
  float fStack_58f0;
  float fStack_58ec;
  float fStack_58e8;
  float fStack_58e4;
  float local_58e0;
  float fStack_58dc;
  float fStack_58d8;
  float fStack_58d4;
  float fStack_58d0;
  float fStack_58cc;
  float fStack_58c8;
  float fStack_58c4;
  float local_58c0;
  float fStack_58bc;
  float fStack_58b8;
  float fStack_58b4;
  float fStack_58b0;
  float fStack_58ac;
  float fStack_58a8;
  float fStack_58a4;
  float local_58a0;
  float fStack_589c;
  float fStack_5898;
  float fStack_5894;
  float fStack_5890;
  float fStack_588c;
  float fStack_5888;
  float fStack_5884;
  float local_5880;
  float fStack_587c;
  float fStack_5878;
  float fStack_5874;
  float fStack_5870;
  float fStack_586c;
  float fStack_5868;
  float fStack_5864;
  float local_5860;
  float fStack_585c;
  float fStack_5858;
  float fStack_5854;
  float fStack_5850;
  float fStack_584c;
  float fStack_5848;
  float fStack_5844;
  float local_5840;
  float fStack_583c;
  float fStack_5838;
  float fStack_5834;
  float fStack_5830;
  float fStack_582c;
  float fStack_5828;
  float fStack_5824;
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined4 local_4680;
  undefined4 uStack_467c;
  undefined4 uStack_4678;
  undefined4 uStack_4674;
  undefined4 uStack_4670;
  undefined4 uStack_466c;
  undefined4 uStack_4668;
  undefined4 uStack_4664;
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  undefined1 auVar210 [32];
  
  local_5808 = (((BVH *)This->ptr)->root).ptr;
  if (local_5808 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar117 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
      auVar108 = vpcmpeqd_avx(auVar117,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
      auVar117 = vpcmpeqd_avx(auVar117,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
      auVar118 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      auVar135 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar118,5);
      auVar201._16_16_ = auVar117;
      auVar201._0_16_ = auVar108;
      auVar202 = auVar201 & auVar135;
      if ((((((((auVar202 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar202 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar202 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar202 >> 0x7f,0) != '\0') ||
            (auVar202 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar202 >> 0xbf,0) != '\0') ||
          (auVar202 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar202[0x1f] < '\0') {
        local_5960 = vandps_avx(auVar135,auVar201);
        local_5d40._0_8_ = *(undefined8 *)ray;
        local_5d40._8_8_ = *(undefined8 *)(ray + 8);
        local_5d40._16_8_ = *(undefined8 *)(ray + 0x10);
        local_5d40._24_8_ = *(undefined8 *)(ray + 0x18);
        local_5d40._32_8_ = *(undefined8 *)(ray + 0x20);
        local_5d40._40_8_ = *(undefined8 *)(ray + 0x28);
        local_5d40._48_8_ = *(undefined8 *)(ray + 0x30);
        local_5d40._56_8_ = *(undefined8 *)(ray + 0x38);
        local_5d40._64_8_ = *(undefined8 *)(ray + 0x40);
        local_5d40._72_8_ = *(undefined8 *)(ray + 0x48);
        local_5d40._80_8_ = *(undefined8 *)(ray + 0x50);
        local_5d40._88_8_ = *(undefined8 *)(ray + 0x58);
        local_5ce0 = *(undefined1 (*) [32])(ray + 0x80);
        local_5cc0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_5ca0 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar246._8_4_ = 0x7fffffff;
        auVar246._0_8_ = 0x7fffffff7fffffff;
        auVar246._12_4_ = 0x7fffffff;
        auVar246._16_4_ = 0x7fffffff;
        auVar246._20_4_ = 0x7fffffff;
        auVar246._24_4_ = 0x7fffffff;
        auVar246._28_4_ = 0x7fffffff;
        auVar222._8_4_ = 0x219392ef;
        auVar222._0_8_ = 0x219392ef219392ef;
        auVar222._12_4_ = 0x219392ef;
        auVar222._16_4_ = 0x219392ef;
        auVar222._20_4_ = 0x219392ef;
        auVar222._24_4_ = 0x219392ef;
        auVar222._28_4_ = 0x219392ef;
        auVar135 = vandps_avx(auVar246,local_5ce0);
        auVar135 = vcmpps_avx(auVar135,auVar222,1);
        auVar202 = vblendvps_avx(local_5ce0,auVar222,auVar135);
        auVar135 = vandps_avx(auVar246,local_5cc0);
        auVar135 = vcmpps_avx(auVar135,auVar222,1);
        auVar201 = vblendvps_avx(local_5cc0,auVar222,auVar135);
        auVar135 = vandps_avx(auVar246,local_5ca0);
        auVar135 = vcmpps_avx(auVar135,auVar222,1);
        auVar135 = vblendvps_avx(local_5ca0,auVar222,auVar135);
        auVar32 = vrcpps_avx(auVar202);
        fVar94 = auVar32._0_4_;
        fVar194 = auVar32._4_4_;
        auVar37._4_4_ = auVar202._4_4_ * fVar194;
        auVar37._0_4_ = auVar202._0_4_ * fVar94;
        fVar219 = auVar32._8_4_;
        auVar37._8_4_ = auVar202._8_4_ * fVar219;
        fVar158 = auVar32._12_4_;
        auVar37._12_4_ = auVar202._12_4_ * fVar158;
        fVar159 = auVar32._16_4_;
        auVar37._16_4_ = auVar202._16_4_ * fVar159;
        fVar160 = auVar32._20_4_;
        auVar37._20_4_ = auVar202._20_4_ * fVar160;
        fVar161 = auVar32._24_4_;
        auVar37._24_4_ = auVar202._24_4_ * fVar161;
        auVar37._28_4_ = auVar202._28_4_;
        auVar232._8_4_ = 0x3f800000;
        auVar232._0_8_ = 0x3f8000003f800000;
        auVar232._12_4_ = 0x3f800000;
        auVar232._16_4_ = 0x3f800000;
        auVar232._20_4_ = 0x3f800000;
        auVar232._24_4_ = 0x3f800000;
        auVar232._28_4_ = 0x3f800000;
        auVar202 = vsubps_avx(auVar232,auVar37);
        local_5c80._0_4_ = fVar94 + fVar94 * auVar202._0_4_;
        local_5c80._4_4_ = fVar194 + fVar194 * auVar202._4_4_;
        fStack_5c78 = fVar219 + fVar219 * auVar202._8_4_;
        fStack_5c74 = fVar158 + fVar158 * auVar202._12_4_;
        fStack_5c70 = fVar159 + fVar159 * auVar202._16_4_;
        fStack_5c6c = fVar160 + fVar160 * auVar202._20_4_;
        fStack_5c68 = fVar161 + fVar161 * auVar202._24_4_;
        register0x0000129c = auVar32._28_4_ + auVar202._28_4_;
        auVar202 = vrcpps_avx(auVar201);
        fVar94 = auVar202._0_4_;
        fVar194 = auVar202._4_4_;
        auVar32._4_4_ = auVar201._4_4_ * fVar194;
        auVar32._0_4_ = auVar201._0_4_ * fVar94;
        fVar219 = auVar202._8_4_;
        auVar32._8_4_ = auVar201._8_4_ * fVar219;
        fVar158 = auVar202._12_4_;
        auVar32._12_4_ = auVar201._12_4_ * fVar158;
        fVar159 = auVar202._16_4_;
        auVar32._16_4_ = auVar201._16_4_ * fVar159;
        fVar160 = auVar202._20_4_;
        auVar32._20_4_ = auVar201._20_4_ * fVar160;
        fVar161 = auVar202._24_4_;
        auVar32._24_4_ = auVar201._24_4_ * fVar161;
        auVar32._28_4_ = auVar201._28_4_;
        auVar201 = vsubps_avx(auVar232,auVar32);
        local_5c60._0_4_ = fVar94 + fVar94 * auVar201._0_4_;
        local_5c60._4_4_ = fVar194 + fVar194 * auVar201._4_4_;
        fStack_5c58 = fVar219 + fVar219 * auVar201._8_4_;
        fStack_5c54 = fVar158 + fVar158 * auVar201._12_4_;
        fStack_5c50 = fVar159 + fVar159 * auVar201._16_4_;
        fStack_5c4c = fVar160 + fVar160 * auVar201._20_4_;
        fStack_5c48 = fVar161 + fVar161 * auVar201._24_4_;
        register0x000012dc = auVar202._28_4_ + auVar201._28_4_;
        auVar202 = vrcpps_avx(auVar135);
        fVar94 = auVar202._0_4_;
        fVar194 = auVar202._4_4_;
        auVar33._4_4_ = auVar135._4_4_ * fVar194;
        auVar33._0_4_ = auVar135._0_4_ * fVar94;
        fVar219 = auVar202._8_4_;
        auVar33._8_4_ = auVar135._8_4_ * fVar219;
        fVar158 = auVar202._12_4_;
        auVar33._12_4_ = auVar135._12_4_ * fVar158;
        fVar159 = auVar202._16_4_;
        auVar33._16_4_ = auVar135._16_4_ * fVar159;
        fVar160 = auVar202._20_4_;
        auVar33._20_4_ = auVar135._20_4_ * fVar160;
        fVar161 = auVar202._24_4_;
        auVar33._24_4_ = auVar135._24_4_ * fVar161;
        auVar33._28_4_ = auVar135._28_4_;
        auVar135 = vsubps_avx(auVar232,auVar33);
        local_5c40._0_4_ = fVar94 + fVar94 * auVar135._0_4_;
        local_5c40._4_4_ = fVar194 + fVar194 * auVar135._4_4_;
        fStack_5c38 = fVar219 + fVar219 * auVar135._8_4_;
        fStack_5c34 = fVar158 + fVar158 * auVar135._12_4_;
        fStack_5c30 = fVar159 + fVar159 * auVar135._16_4_;
        fStack_5c2c = fVar160 + fVar160 * auVar135._20_4_;
        fStack_5c28 = fVar161 + fVar161 * auVar135._24_4_;
        register0x0000131c = auVar202._28_4_ + auVar135._28_4_;
        auVar223._8_4_ = 0x20;
        auVar223._0_8_ = 0x2000000020;
        auVar223._12_4_ = 0x20;
        auVar223._16_4_ = 0x20;
        auVar223._20_4_ = 0x20;
        auVar223._24_4_ = 0x20;
        auVar223._28_4_ = 0x20;
        auVar135 = vcmpps_avx(_local_5c80,auVar118,1);
        local_5c20 = vandps_avx(auVar135,auVar223);
        auVar135 = vcmpps_avx(_local_5c60,auVar118,5);
        auVar202._8_4_ = 0x40;
        auVar202._0_8_ = 0x4000000040;
        auVar202._12_4_ = 0x40;
        auVar202._16_4_ = 0x40;
        auVar202._20_4_ = 0x40;
        auVar202._24_4_ = 0x40;
        auVar202._28_4_ = 0x40;
        auVar224._8_4_ = 0x60;
        auVar224._0_8_ = 0x6000000060;
        auVar224._12_4_ = 0x60;
        auVar224._16_4_ = 0x60;
        auVar224._20_4_ = 0x60;
        auVar224._24_4_ = 0x60;
        auVar224._28_4_ = 0x60;
        local_5c00 = vblendvps_avx(auVar224,auVar202,auVar135);
        auVar135 = vcmpps_avx(_local_5c40,auVar118,5);
        auVar203._8_4_ = 0x80;
        auVar203._0_8_ = 0x8000000080;
        auVar203._12_4_ = 0x80;
        auVar203._16_4_ = 0x80;
        auVar203._20_4_ = 0x80;
        auVar203._24_4_ = 0x80;
        auVar203._28_4_ = 0x80;
        auVar210._8_4_ = 0xa0;
        auVar210._0_8_ = 0xa0000000a0;
        auVar210._12_4_ = 0xa0;
        auVar210._16_4_ = 0xa0;
        auVar210._20_4_ = 0xa0;
        auVar210._24_4_ = 0xa0;
        auVar210._28_4_ = 0xa0;
        auVar211 = ZEXT3264(auVar210);
        local_5be0 = vblendvps_avx(auVar210,auVar203,auVar135);
        auVar135 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar118);
        auVar202 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar118);
        auVar146._8_4_ = 0x7f800000;
        auVar146._0_8_ = 0x7f8000007f800000;
        auVar146._12_4_ = 0x7f800000;
        auVar146._16_4_ = 0x7f800000;
        auVar146._20_4_ = 0x7f800000;
        auVar146._24_4_ = 0x7f800000;
        auVar146._28_4_ = 0x7f800000;
        local_5bc0 = vblendvps_avx(auVar146,auVar135,local_5960);
        auVar135._8_4_ = 0xff800000;
        auVar135._0_8_ = 0xff800000ff800000;
        auVar135._12_4_ = 0xff800000;
        auVar135._16_4_ = 0xff800000;
        auVar135._20_4_ = 0xff800000;
        auVar135._24_4_ = 0xff800000;
        auVar135._28_4_ = 0xff800000;
        local_5ba0 = vblendvps_avx(auVar135,auVar202,local_5960);
        auVar180 = ZEXT3264(local_5ba0);
        auVar135 = vcmpps_avx(auVar118,auVar118,0xf);
        local_5f40._4_4_ = local_5960._4_4_ ^ auVar135._4_4_;
        local_5f40._0_4_ = local_5960._0_4_ ^ auVar135._0_4_;
        local_5f40._8_4_ = local_5960._8_4_ ^ auVar135._8_4_;
        local_5f40._12_4_ = local_5960._12_4_ ^ auVar135._12_4_;
        local_5f40._16_4_ = local_5960._16_4_ ^ auVar135._16_4_;
        uStack_5f2c = local_5960._20_4_ ^ auVar135._20_4_;
        uStack_5f28 = local_5960._24_4_ ^ auVar135._24_4_;
        uStack_5f24 = local_5960._28_4_ ^ auVar135._28_4_;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar100 = 7;
        }
        else {
          uVar100 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5f10 = (BVH *)This->ptr;
        local_5f08 = This;
        local_5fd8 = ray + 0x100;
        puVar104 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar103 = (undefined1 (*) [32])local_4640;
        local_4680 = 0x7f800000;
        uStack_467c = 0x7f800000;
        uStack_4678 = 0x7f800000;
        uStack_4674 = 0x7f800000;
        uStack_4670 = 0x7f800000;
        uStack_466c = 0x7f800000;
        uStack_4668 = 0x7f800000;
        uStack_4664 = 0x7f800000;
        local_4660 = local_5bc0;
        local_5fc0 = mm_lookupmask_ps._16_8_;
        uStack_5fb8 = mm_lookupmask_ps._24_8_;
        uStack_5fb0 = mm_lookupmask_ps._16_8_;
        uStack_5fa8 = mm_lookupmask_ps._24_8_;
        local_5fd0 = (undefined1 (*) [32])&local_5aa0;
        local_5fc8 = uVar100;
LAB_01549052:
        do {
          do {
            auVar117 = auVar180._0_16_;
            root.ptr = puVar104[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_0154ad0b;
            puVar104 = puVar104 + -1;
            pauVar103 = pauVar103 + -1;
            local_6180 = *pauVar103;
            auVar157 = ZEXT3264(local_6180);
            auVar135 = vcmpps_avx(local_6180,local_5ba0,1);
          } while ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar135 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar135 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar135 >> 0x7f,0) == '\0') &&
                     (auVar135 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar135 >> 0xbf,0) == '\0') &&
                   (auVar135 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   -1 < auVar135[0x1f]);
          uVar105 = vmovmskps_avx(auVar135);
          unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar105);
          if (uVar100 < (uint)POPCOUNT(uVar105)) {
LAB_01549091:
            do {
              auVar117 = auVar180._0_16_;
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_0154ad0b;
                auVar135 = vcmpps_avx(local_5ba0,auVar157._0_32_,6);
                if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar135 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar135 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar135 >> 0x7f,0) != '\0') ||
                      (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar135 >> 0xbf,0) != '\0') ||
                    (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar135[0x1f] < '\0') {
                  local_5f00 = (ulong)((uint)root.ptr & 0xf) - 8;
                  auVar155 = _local_5f40;
                  if (local_5f00 != 0) {
                    uVar99 = root.ptr & 0xfffffffffffffff0;
                    local_5f80 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x40),
                                            ZEXT1632(ZEXT816(0) << 0x40),0xf);
                    local_5ea0._4_4_ = local_5f40._4_4_ ^ local_5f80._4_4_;
                    local_5ea0._0_4_ = local_5f40._0_4_ ^ local_5f80._0_4_;
                    local_5ea0._8_4_ = local_5f40._8_4_ ^ local_5f80._8_4_;
                    local_5ea0._12_4_ = local_5f40._12_4_ ^ local_5f80._12_4_;
                    local_5ea0._16_4_ = local_5f40._16_4_ ^ local_5f80._16_4_;
                    local_5ea0._20_4_ = local_5f40._20_4_ ^ local_5f80._20_4_;
                    local_5ea0._24_4_ = local_5f40._24_4_ ^ local_5f80._24_4_;
                    local_5ea0._28_4_ = local_5f40._28_4_ ^ local_5f80._28_4_;
                    lVar96 = 0;
                    do {
                      local_5ef8 = lVar96;
                      lVar96 = lVar96 * 0x90;
                      auVar108._8_8_ = 0;
                      auVar108._0_8_ = *(ulong *)(uVar99 + 0x40 + lVar96);
                      auVar145._8_8_ = 0;
                      auVar145._0_8_ = *(ulong *)(uVar99 + 0x48 + lVar96);
                      auVar117 = vpminub_avx(auVar108,auVar145);
                      auVar117 = vpcmpeqb_avx(auVar108,auVar117);
                      auVar145 = vpcmpeqd_avx(auVar211._0_16_,auVar211._0_16_);
                      auVar211 = ZEXT1664(auVar145);
                      auVar109 = vpmovsxbd_avx(auVar117 ^ auVar145);
                      auVar140._8_8_ = 0;
                      auVar140._0_8_ = *(ulong *)(uVar99 + 0x44 + lVar96);
                      auVar196._8_8_ = 0;
                      auVar196._0_8_ = *(ulong *)(uVar99 + 0x4c + lVar96);
                      auVar117 = vpminub_avx(auVar140,auVar196);
                      auVar108 = vpcmpeqb_avx(auVar140,auVar117);
                      auVar108 = vpmovsxbd_avx(auVar108 ^ auVar145);
                      auVar122._16_16_ = auVar108;
                      auVar122._0_16_ = auVar109;
                      auVar135 = vcvtdq2ps_avx(auVar122);
                      auVar149._8_4_ = 0xbf800000;
                      auVar149._0_8_ = 0xbf800000bf800000;
                      auVar149._12_4_ = 0xbf800000;
                      auVar149._16_4_ = 0xbf800000;
                      auVar149._20_4_ = 0xbf800000;
                      auVar149._24_4_ = 0xbf800000;
                      auVar149._28_4_ = 0xbf800000;
                      auVar135 = vcmpps_avx(auVar149,auVar135,1);
                      uVar92 = vmovmskps_avx(auVar135);
                      if (uVar92 != 0) {
                        lVar96 = lVar96 + uVar99;
                        uVar95 = (ulong)(uVar92 & 0xff);
                        local_5ef0 = lVar96;
                        do {
                          lVar12 = 0;
                          if (uVar95 != 0) {
                            for (; (uVar95 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                            }
                          }
                          auVar109._8_8_ = 0;
                          auVar109._0_8_ = *(ulong *)(lVar96 + 0x40);
                          auVar117 = vpmovzxbd_avx(auVar109);
                          auVar141._8_8_ = 0;
                          auVar141._0_8_ = *(ulong *)(lVar96 + 0x44);
                          auVar108 = vpmovzxbd_avx(auVar141);
                          auVar123._16_16_ = auVar108;
                          auVar123._0_16_ = auVar117;
                          auVar135 = vcvtdq2ps_avx(auVar123);
                          fVar94 = *(float *)(lVar96 + 0x7c);
                          fVar194 = *(float *)(lVar96 + 0x70);
                          local_5b80._4_4_ = fVar194 + fVar94 * auVar135._4_4_;
                          local_5b80._0_4_ = fVar194 + fVar94 * auVar135._0_4_;
                          uStack_5b78._0_4_ = fVar194 + fVar94 * auVar135._8_4_;
                          uStack_5b78._4_4_ = fVar194 + fVar94 * auVar135._12_4_;
                          uStack_5b70._0_4_ = fVar194 + fVar94 * auVar135._16_4_;
                          uStack_5b70._4_4_ = fVar194 + fVar94 * auVar135._20_4_;
                          uStack_5b68._0_4_ = fVar194 + fVar94 * auVar135._24_4_;
                          uStack_5b68._4_4_ = fVar194 + auVar135._28_4_;
                          auVar110._8_8_ = 0;
                          auVar110._0_8_ = *(ulong *)(lVar96 + 0x48);
                          auVar117 = vpmovzxbd_avx(auVar110);
                          auVar197._8_8_ = 0;
                          auVar197._0_8_ = *(ulong *)(lVar96 + 0x4c);
                          auVar108 = vpmovzxbd_avx(auVar197);
                          auVar124._16_16_ = auVar108;
                          auVar124._0_16_ = auVar117;
                          auVar135 = vcvtdq2ps_avx(auVar124);
                          local_5a60 = CONCAT44(fVar194 + fVar94 * auVar135._4_4_,
                                                fVar194 + fVar94 * auVar135._0_4_);
                          uStack_5a58 = CONCAT44(fVar194 + fVar94 * auVar135._12_4_,
                                                 fVar194 + fVar94 * auVar135._8_4_);
                          uStack_5a50 = CONCAT44(fVar194 + fVar94 * auVar135._20_4_,
                                                 fVar194 + fVar94 * auVar135._16_4_);
                          uStack_5a48 = CONCAT44(fVar194 + auVar135._28_4_,
                                                 fVar194 + fVar94 * auVar135._24_4_);
                          auVar111._8_8_ = 0;
                          auVar111._0_8_ = *(ulong *)(lVar96 + 0x50);
                          auVar117 = vpmovzxbd_avx(auVar111);
                          auVar142._8_8_ = 0;
                          auVar142._0_8_ = *(ulong *)(lVar96 + 0x54);
                          auVar108 = vpmovzxbd_avx(auVar142);
                          auVar125._16_16_ = auVar108;
                          auVar125._0_16_ = auVar117;
                          auVar135 = vcvtdq2ps_avx(auVar125);
                          fVar94 = *(float *)(lVar96 + 0x80);
                          fVar194 = *(float *)(lVar96 + 0x74);
                          local_60c0._4_4_ = fVar194 + fVar94 * auVar135._4_4_;
                          local_60c0._0_4_ = fVar194 + fVar94 * auVar135._0_4_;
                          uStack_60b8 = (void *)CONCAT44(fVar194 + fVar94 * auVar135._12_4_,
                                                         fVar194 + fVar94 * auVar135._8_4_);
                          uStack_60b0 = (RTCRayQueryContext *)
                                        CONCAT44(fVar194 + fVar94 * auVar135._20_4_,
                                                 fVar194 + fVar94 * auVar135._16_4_);
                          uStack_60a8 = (RayK<8> *)
                                        CONCAT44(fVar194 + auVar135._28_4_,
                                                 fVar194 + fVar94 * auVar135._24_4_);
                          auVar112._8_8_ = 0;
                          auVar112._0_8_ = *(ulong *)(lVar96 + 0x58);
                          auVar117 = vpmovzxbd_avx(auVar112);
                          auVar198._8_8_ = 0;
                          auVar198._0_8_ = *(ulong *)(lVar96 + 0x5c);
                          auVar108 = vpmovzxbd_avx(auVar198);
                          auVar126._16_16_ = auVar108;
                          auVar126._0_16_ = auVar117;
                          auVar135 = vcvtdq2ps_avx(auVar126);
                          local_60e0._4_4_ = fVar194 + fVar94 * auVar135._4_4_;
                          local_60e0._0_4_ = fVar194 + fVar94 * auVar135._0_4_;
                          fStack_60d8 = fVar194 + fVar94 * auVar135._8_4_;
                          fStack_60d4 = fVar194 + fVar94 * auVar135._12_4_;
                          auStack_60d0._0_4_ = fVar194 + fVar94 * auVar135._16_4_;
                          auStack_60d0._4_4_ = fVar194 + fVar94 * auVar135._20_4_;
                          fStack_60c8 = fVar194 + fVar94 * auVar135._24_4_;
                          fStack_60c4 = fVar194 + auVar135._28_4_;
                          auVar113._8_8_ = 0;
                          auVar113._0_8_ = *(ulong *)(lVar96 + 0x60);
                          auVar117 = vpmovzxbd_avx(auVar113);
                          auVar143._8_8_ = 0;
                          auVar143._0_8_ = *(ulong *)(lVar96 + 100);
                          auVar108 = vpmovzxbd_avx(auVar143);
                          auVar127._16_16_ = auVar108;
                          auVar127._0_16_ = auVar117;
                          auVar135 = vcvtdq2ps_avx(auVar127);
                          fVar94 = *(float *)(lVar96 + 0x84);
                          fVar194 = *(float *)(lVar96 + 0x78);
                          local_5e40 = CONCAT44(fVar194 + fVar94 * auVar135._4_4_,
                                                fVar194 + fVar94 * auVar135._0_4_);
                          uStack_5e38 = CONCAT44(fVar194 + fVar94 * auVar135._12_4_,
                                                 fVar194 + fVar94 * auVar135._8_4_);
                          fStack_5e30 = fVar194 + fVar94 * auVar135._16_4_;
                          fStack_5e2c = fVar194 + fVar94 * auVar135._20_4_;
                          fStack_5e28 = fVar194 + fVar94 * auVar135._24_4_;
                          fStack_5e24 = fVar194 + auVar135._28_4_;
                          auVar114._8_8_ = 0;
                          auVar114._0_8_ = *(ulong *)(lVar96 + 0x68);
                          auVar117 = vpmovzxbd_avx(auVar114);
                          auVar199._8_8_ = 0;
                          auVar199._0_8_ = *(ulong *)(lVar96 + 0x6c);
                          auVar108 = vpmovzxbd_avx(auVar199);
                          auVar128._16_16_ = auVar108;
                          auVar128._0_16_ = auVar117;
                          auVar135 = vcvtdq2ps_avx(auVar128);
                          local_5e60 = CONCAT44(fVar194 + fVar94 * auVar135._4_4_,
                                                fVar194 + fVar94 * auVar135._0_4_);
                          uStack_5e58 = CONCAT44(fVar194 + fVar94 * auVar135._12_4_,
                                                 fVar194 + fVar94 * auVar135._8_4_);
                          fStack_5e50 = fVar194 + fVar94 * auVar135._16_4_;
                          fStack_5e4c = fVar194 + fVar94 * auVar135._20_4_;
                          fStack_5e48 = fVar194 + fVar94 * auVar135._24_4_;
                          fStack_5e44 = fVar194 + auVar135._28_4_;
                          uVar105 = *(undefined4 *)(local_5b80 + lVar12 * 4);
                          auVar129._4_4_ = uVar105;
                          auVar129._0_4_ = uVar105;
                          auVar129._8_4_ = uVar105;
                          auVar129._12_4_ = uVar105;
                          auVar129._16_4_ = uVar105;
                          auVar129._20_4_ = uVar105;
                          auVar129._24_4_ = uVar105;
                          auVar129._28_4_ = uVar105;
                          auVar79._8_8_ = local_5d40._8_8_;
                          auVar79._0_8_ = local_5d40._0_8_;
                          auVar79._16_8_ = local_5d40._16_8_;
                          auVar79._24_8_ = local_5d40._24_8_;
                          auVar81._8_8_ = local_5d40._40_8_;
                          auVar81._0_8_ = local_5d40._32_8_;
                          auVar81._16_8_ = local_5d40._48_8_;
                          auVar81._24_8_ = local_5d40._56_8_;
                          auVar83._8_8_ = local_5d40._72_8_;
                          auVar83._0_8_ = local_5d40._64_8_;
                          auVar83._16_8_ = local_5d40._80_8_;
                          auVar83._24_8_ = local_5d40._88_8_;
                          auVar135 = vsubps_avx(auVar129,auVar79);
                          auVar115._0_4_ = (float)local_5c80._0_4_ * auVar135._0_4_;
                          auVar115._4_4_ = (float)local_5c80._4_4_ * auVar135._4_4_;
                          auVar115._8_4_ = fStack_5c78 * auVar135._8_4_;
                          auVar115._12_4_ = fStack_5c74 * auVar135._12_4_;
                          auVar44._16_4_ = fStack_5c70 * auVar135._16_4_;
                          auVar44._0_16_ = auVar115;
                          auVar44._20_4_ = fStack_5c6c * auVar135._20_4_;
                          auVar44._24_4_ = fStack_5c68 * auVar135._24_4_;
                          auVar44._28_4_ = auVar135._28_4_;
                          uVar105 = *(undefined4 *)(local_60c0 + lVar12 * 4);
                          auVar150._4_4_ = uVar105;
                          auVar150._0_4_ = uVar105;
                          auVar150._8_4_ = uVar105;
                          auVar150._12_4_ = uVar105;
                          auVar150._16_4_ = uVar105;
                          auVar150._20_4_ = uVar105;
                          auVar150._24_4_ = uVar105;
                          auVar150._28_4_ = uVar105;
                          auVar135 = vsubps_avx(auVar150,auVar81);
                          auVar144._0_4_ = (float)local_5c60._0_4_ * auVar135._0_4_;
                          auVar144._4_4_ = (float)local_5c60._4_4_ * auVar135._4_4_;
                          auVar144._8_4_ = fStack_5c58 * auVar135._8_4_;
                          auVar144._12_4_ = fStack_5c54 * auVar135._12_4_;
                          auVar45._16_4_ = fStack_5c50 * auVar135._16_4_;
                          auVar45._0_16_ = auVar144;
                          auVar45._20_4_ = fStack_5c4c * auVar135._20_4_;
                          auVar45._24_4_ = fStack_5c48 * auVar135._24_4_;
                          auVar45._28_4_ = auVar135._28_4_;
                          uVar105 = *(undefined4 *)((long)&local_5e40 + lVar12 * 4);
                          auVar169._4_4_ = uVar105;
                          auVar169._0_4_ = uVar105;
                          auVar169._8_4_ = uVar105;
                          auVar169._12_4_ = uVar105;
                          auVar169._16_4_ = uVar105;
                          auVar169._20_4_ = uVar105;
                          auVar169._24_4_ = uVar105;
                          auVar169._28_4_ = uVar105;
                          auVar135 = vsubps_avx(auVar169,auVar83);
                          auVar166._0_4_ = (float)local_5c40._0_4_ * auVar135._0_4_;
                          auVar166._4_4_ = (float)local_5c40._4_4_ * auVar135._4_4_;
                          auVar166._8_4_ = fStack_5c38 * auVar135._8_4_;
                          auVar166._12_4_ = fStack_5c34 * auVar135._12_4_;
                          auVar46._16_4_ = fStack_5c30 * auVar135._16_4_;
                          auVar46._0_16_ = auVar166;
                          auVar46._20_4_ = fStack_5c2c * auVar135._20_4_;
                          auVar46._24_4_ = fStack_5c28 * auVar135._24_4_;
                          auVar46._28_4_ = auVar135._28_4_;
                          uVar105 = *(undefined4 *)((long)&local_5a60 + lVar12 * 4);
                          auVar248._4_4_ = uVar105;
                          auVar248._0_4_ = uVar105;
                          auVar248._8_4_ = uVar105;
                          auVar248._12_4_ = uVar105;
                          auVar248._16_4_ = uVar105;
                          auVar248._20_4_ = uVar105;
                          auVar248._24_4_ = uVar105;
                          auVar248._28_4_ = uVar105;
                          auVar135 = vsubps_avx(auVar248,auVar79);
                          auVar200._0_4_ = (float)local_5c80._0_4_ * auVar135._0_4_;
                          auVar200._4_4_ = (float)local_5c80._4_4_ * auVar135._4_4_;
                          auVar200._8_4_ = fStack_5c78 * auVar135._8_4_;
                          auVar200._12_4_ = fStack_5c74 * auVar135._12_4_;
                          auVar47._16_4_ = fStack_5c70 * auVar135._16_4_;
                          auVar47._0_16_ = auVar200;
                          auVar47._20_4_ = fStack_5c6c * auVar135._20_4_;
                          auVar47._24_4_ = fStack_5c68 * auVar135._24_4_;
                          auVar47._28_4_ = auVar135._28_4_;
                          uVar105 = *(undefined4 *)(local_60e0 + lVar12 * 4);
                          auVar233._4_4_ = uVar105;
                          auVar233._0_4_ = uVar105;
                          auVar233._8_4_ = uVar105;
                          auVar233._12_4_ = uVar105;
                          auVar233._16_4_ = uVar105;
                          auVar233._20_4_ = uVar105;
                          auVar233._24_4_ = uVar105;
                          auVar233._28_4_ = uVar105;
                          auVar135 = vsubps_avx(auVar233,auVar81);
                          auVar209._0_4_ = (float)local_5c60._0_4_ * auVar135._0_4_;
                          auVar209._4_4_ = (float)local_5c60._4_4_ * auVar135._4_4_;
                          auVar209._8_4_ = fStack_5c58 * auVar135._8_4_;
                          auVar209._12_4_ = fStack_5c54 * auVar135._12_4_;
                          auVar48._16_4_ = fStack_5c50 * auVar135._16_4_;
                          auVar48._0_16_ = auVar209;
                          auVar48._20_4_ = fStack_5c4c * auVar135._20_4_;
                          auVar48._24_4_ = fStack_5c48 * auVar135._24_4_;
                          auVar48._28_4_ = auVar135._28_4_;
                          auVar211 = ZEXT3264(auVar48);
                          uVar105 = *(undefined4 *)((long)&local_5e60 + lVar12 * 4);
                          auVar234._4_4_ = uVar105;
                          auVar234._0_4_ = uVar105;
                          auVar234._8_4_ = uVar105;
                          auVar234._12_4_ = uVar105;
                          auVar234._16_4_ = uVar105;
                          auVar234._20_4_ = uVar105;
                          auVar234._24_4_ = uVar105;
                          auVar234._28_4_ = uVar105;
                          auVar135 = vsubps_avx(auVar234,auVar83);
                          auVar221._0_4_ = (float)local_5c40._0_4_ * auVar135._0_4_;
                          auVar221._4_4_ = (float)local_5c40._4_4_ * auVar135._4_4_;
                          auVar221._8_4_ = fStack_5c38 * auVar135._8_4_;
                          auVar221._12_4_ = fStack_5c34 * auVar135._12_4_;
                          auVar49._16_4_ = fStack_5c30 * auVar135._16_4_;
                          auVar49._0_16_ = auVar221;
                          auVar49._20_4_ = fStack_5c2c * auVar135._20_4_;
                          auVar49._24_4_ = fStack_5c28 * auVar135._24_4_;
                          auVar49._28_4_ = auVar135._28_4_;
                          auVar117 = vpminsd_avx(auVar44._16_16_,auVar47._16_16_);
                          auVar108 = vpminsd_avx(auVar115,auVar200);
                          auVar145 = vpminsd_avx(auVar45._16_16_,auVar48._16_16_);
                          auVar117 = vpmaxsd_avx(auVar117,auVar145);
                          auVar145 = vpminsd_avx(auVar144,auVar209);
                          auVar108 = vpmaxsd_avx(auVar108,auVar145);
                          auVar145 = vpminsd_avx(auVar166,auVar221);
                          auVar108 = vpmaxsd_avx(auVar108,auVar145);
                          auVar145 = vpminsd_avx(auVar46._16_16_,auVar49._16_16_);
                          auVar145 = vpmaxsd_avx(auVar117,auVar145);
                          auVar117 = vpmaxsd_avx(auVar108,local_5bc0._0_16_);
                          auVar108 = vpmaxsd_avx(auVar145,local_5bc0._16_16_);
                          auVar145 = vpmaxsd_avx(auVar44._16_16_,auVar47._16_16_);
                          auVar109 = vpmaxsd_avx(auVar115,auVar200);
                          auVar140 = vpmaxsd_avx(auVar45._16_16_,auVar48._16_16_);
                          auVar140 = vpminsd_avx(auVar145,auVar140);
                          auVar145 = vpmaxsd_avx(auVar144,auVar209);
                          auVar109 = vpminsd_avx(auVar109,auVar145);
                          auVar145 = vpmaxsd_avx(auVar166,auVar221);
                          auVar109 = vpminsd_avx(auVar109,auVar145);
                          auVar145 = vpmaxsd_avx(auVar46._16_16_,auVar49._16_16_);
                          auVar145 = vpminsd_avx(auVar140,auVar145);
                          auVar109 = vpminsd_avx(auVar109,local_5ba0._0_16_);
                          auVar145 = vpminsd_avx(auVar145,local_5ba0._16_16_);
                          auVar170._16_16_ = auVar108;
                          auVar170._0_16_ = auVar117;
                          auVar130._16_16_ = auVar145;
                          auVar130._0_16_ = auVar109;
                          auVar135 = vcmpps_avx(auVar170,auVar130,2);
                          auVar135 = local_5ea0 & auVar135;
                          if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar135 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar135 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(auVar135 >> 0x7f,0) == '\0') &&
                                (auVar135 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar135 >> 0xbf,0) == '\0') &&
                              (auVar135 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                              && -1 < auVar135[0x1f]) {
                            bVar107 = false;
                          }
                          else {
                            local_5ee8 = uVar95;
                            uVar6 = *(ushort *)(lVar96 + lVar12 * 8);
                            uVar7 = *(ushort *)(lVar96 + 2 + lVar12 * 8);
                            uVar92 = *(uint *)(lVar96 + 0x88);
                            uVar182 = *(uint *)(lVar96 + 4 + lVar12 * 8);
                            pGVar8 = (context->scene->geometries).items[uVar92].ptr;
                            lVar12 = *(long *)&pGVar8->field_0x58;
                            lVar9 = *(long *)&pGVar8[1].time_range.upper;
                            lVar101 = (ulong)uVar182 *
                                      pGVar8[1].super_RefCount.refCounter.
                                      super___atomic_base<unsigned_long>._M_i;
                            uVar93 = uVar6 & 0x7fff;
                            fVar94 = (float)(uVar7 & 0x7fff);
                            uVar184 = *(uint *)(lVar12 + 4 + lVar101);
                            uVar95 = (ulong)uVar184;
                            uVar106 = (ulong)(uVar184 * (int)fVar94 +
                                             *(int *)(lVar12 + lVar101) + uVar93);
                            p_Var10 = pGVar8[1].intersectionFilterN;
                            puVar1 = (undefined8 *)(lVar9 + (long)p_Var10 * uVar106);
                            puVar2 = (undefined8 *)(lVar9 + (uVar106 + 1) * (long)p_Var10);
                            uStack_5a50 = *puVar2;
                            uStack_5a48 = puVar2[1];
                            lVar96 = uVar106 + uVar95;
                            puVar2 = (undefined8 *)(lVar9 + lVar96 * (long)p_Var10);
                            local_5a30 = *puVar2;
                            uStack_5a28 = puVar2[1];
                            lVar102 = uVar106 + uVar95 + 1;
                            puVar2 = (undefined8 *)(lVar9 + lVar102 * (long)p_Var10);
                            local_5a40 = *puVar2;
                            uStack_5a38 = puVar2[1];
                            uVar100 = (ulong)(-1 < (short)uVar6);
                            puVar2 = (undefined8 *)(lVar9 + (uVar106 + uVar100 + 1) * (long)p_Var10)
                            ;
                            lVar97 = uVar100 + lVar102;
                            puVar3 = (undefined8 *)(lVar9 + lVar97 * (long)p_Var10);
                            local_5a00 = *puVar3;
                            uStack_59f8 = puVar3[1];
                            if ((short)uVar7 < 0) {
                              uVar95 = 0;
                            }
                            puVar3 = (undefined8 *)(lVar9 + (lVar96 + uVar95) * (long)p_Var10);
                            puVar4 = (undefined8 *)(lVar9 + (lVar102 + uVar95) * (long)p_Var10);
                            local_59c0 = *puVar4;
                            uStack_59b8 = puVar4[1];
                            puVar4 = (undefined8 *)(lVar9 + (uVar95 + lVar97) * (long)p_Var10);
                            local_5a60 = *puVar1;
                            uStack_5a58 = puVar1[1];
                            local_5a20 = uStack_5a50;
                            uStack_5a18 = uStack_5a48;
                            local_5a10 = *puVar2;
                            uStack_5a08 = puVar2[1];
                            local_59f0 = local_5a40;
                            uStack_59e8 = uStack_5a38;
                            local_59e0 = local_5a30;
                            uStack_59d8 = uStack_5a28;
                            local_59d0 = local_5a40;
                            uStack_59c8 = uStack_5a38;
                            local_59b0 = *puVar3;
                            uStack_59a8 = puVar3[1];
                            local_59a0 = local_5a40;
                            uStack_5998 = uStack_5a38;
                            local_5990 = local_5a00;
                            uStack_5988 = uStack_59f8;
                            local_5980 = *puVar4;
                            uStack_5978 = puVar4[1];
                            local_5970 = local_59c0;
                            uStack_5968 = uStack_59b8;
                            local_5d90 = vshufps_avx(ZEXT416(uVar92),ZEXT416(uVar92),0);
                            local_5da0 = vshufps_avx(ZEXT416(uVar182),ZEXT416(uVar182),0);
                            pfVar98 = (float *)&uStack_5a28;
                            auVar180 = ZEXT3264(local_5ea0);
                            uVar100 = 0;
                            do {
                              _local_61a0 = auVar180._0_32_;
                              fVar194 = pfVar98[-0xe];
                              auVar171._4_4_ = fVar194;
                              auVar171._0_4_ = fVar194;
                              auVar171._8_4_ = fVar194;
                              auVar171._12_4_ = fVar194;
                              auVar171._16_4_ = fVar194;
                              auVar171._20_4_ = fVar194;
                              auVar171._24_4_ = fVar194;
                              auVar171._28_4_ = fVar194;
                              fVar219 = pfVar98[-0xd];
                              auVar131._4_4_ = fVar219;
                              auVar131._0_4_ = fVar219;
                              auVar131._8_4_ = fVar219;
                              auVar131._12_4_ = fVar219;
                              auVar131._16_4_ = fVar219;
                              auVar131._20_4_ = fVar219;
                              auVar131._24_4_ = fVar219;
                              auVar131._28_4_ = fVar219;
                              fVar158 = pfVar98[-0xc];
                              auVar205._4_4_ = fVar158;
                              auVar205._0_4_ = fVar158;
                              auVar205._8_4_ = fVar158;
                              auVar205._12_4_ = fVar158;
                              auVar205._16_4_ = fVar158;
                              auVar205._20_4_ = fVar158;
                              auVar205._24_4_ = fVar158;
                              auVar205._28_4_ = fVar158;
                              local_5de0._4_4_ = pfVar98[-10];
                              local_5840 = pfVar98[-9];
                              local_5860 = pfVar98[-8];
                              local_5880 = pfVar98[-2];
                              local_58a0 = pfVar98[-1];
                              local_58c0 = *pfVar98;
                              local_5de0._0_4_ = local_5de0._4_4_;
                              fStack_5dd8 = (float)local_5de0._4_4_;
                              fStack_5dd4 = (float)local_5de0._4_4_;
                              fStack_5dd0 = (float)local_5de0._4_4_;
                              fStack_5dcc = (float)local_5de0._4_4_;
                              fStack_5dc8 = (float)local_5de0._4_4_;
                              fStack_5dc4 = (float)local_5de0._4_4_;
                              fVar34 = fVar194 - (float)local_5de0._4_4_;
                              fStack_583c = local_5840;
                              fStack_5838 = local_5840;
                              fStack_5834 = local_5840;
                              fStack_5830 = local_5840;
                              fStack_582c = local_5840;
                              fStack_5828 = local_5840;
                              fStack_5824 = local_5840;
                              fVar160 = fVar219 - local_5840;
                              fStack_585c = local_5860;
                              fStack_5858 = local_5860;
                              fStack_5854 = local_5860;
                              fStack_5850 = local_5860;
                              fStack_584c = local_5860;
                              fStack_5848 = local_5860;
                              fStack_5844 = local_5860;
                              fVar35 = fVar158 - local_5860;
                              fStack_589c = local_58a0;
                              fStack_5898 = local_58a0;
                              fStack_5894 = local_58a0;
                              fStack_5890 = local_58a0;
                              fStack_588c = local_58a0;
                              fStack_5888 = local_58a0;
                              fStack_5884 = local_58a0;
                              fVar219 = local_58a0 - fVar219;
                              fStack_58bc = local_58c0;
                              fStack_58b8 = local_58c0;
                              fStack_58b4 = local_58c0;
                              fStack_58b0 = local_58c0;
                              fStack_58ac = local_58c0;
                              fStack_58a8 = local_58c0;
                              fStack_58a4 = local_58c0;
                              fVar158 = local_58c0 - fVar158;
                              auVar145 = ZEXT416((uint)(fVar219 * fVar35 - fVar158 * fVar160));
                              local_6000._0_16_ = auVar145;
                              fStack_587c = local_5880;
                              fStack_5878 = local_5880;
                              fStack_5874 = local_5880;
                              fStack_5870 = local_5880;
                              fStack_586c = local_5880;
                              fStack_5868 = local_5880;
                              fStack_5864 = local_5880;
                              fVar36 = local_5880 - fVar194;
                              local_5f60._0_16_ = ZEXT416((uint)fVar35);
                              local_5db0 = ZEXT416((uint)fVar34);
                              local_6130 = ZEXT416((uint)fVar160);
                              local_5e40 = local_5d90._0_8_;
                              uStack_5e38 = local_5d90._8_8_;
                              local_5e60 = local_5da0._0_8_;
                              uStack_5e58 = local_5da0._8_8_;
                              auVar135 = *(undefined1 (*) [32])(ray + 0x20);
                              local_5e00 = auVar135;
                              auVar118 = vsubps_avx(auVar131,auVar135);
                              auVar202 = *(undefined1 (*) [32])(ray + 0x40);
                              local_5e20 = auVar202;
                              auVar201 = vsubps_avx(auVar205,auVar202);
                              fVar15 = *(float *)(ray + 0xa0);
                              fVar16 = *(float *)(ray + 0xa4);
                              fVar17 = *(float *)(ray + 0xa8);
                              fVar19 = *(float *)(ray + 0xac);
                              fVar20 = *(float *)(ray + 0xb0);
                              fVar21 = *(float *)(ray + 0xb4);
                              fVar22 = *(float *)(ray + 0xb8);
                              fVar191 = auVar201._0_4_;
                              fVar207 = auVar201._4_4_;
                              auVar50._4_4_ = fVar207 * fVar16;
                              auVar50._0_4_ = fVar191 * fVar15;
                              fVar212 = auVar201._8_4_;
                              auVar50._8_4_ = fVar212 * fVar17;
                              fVar213 = auVar201._12_4_;
                              auVar50._12_4_ = fVar213 * fVar19;
                              fVar214 = auVar201._16_4_;
                              auVar50._16_4_ = fVar214 * fVar20;
                              fVar215 = auVar201._20_4_;
                              auVar50._20_4_ = fVar215 * fVar21;
                              fVar216 = auVar201._24_4_;
                              auVar50._24_4_ = fVar216 * fVar22;
                              auVar50._28_4_ = auVar202._28_4_;
                              fVar23 = *(float *)(ray + 0xc0);
                              fVar25 = *(float *)(ray + 0xc4);
                              fVar26 = *(float *)(ray + 200);
                              fVar27 = *(float *)(ray + 0xcc);
                              fVar28 = *(float *)(ray + 0xd0);
                              fVar29 = *(float *)(ray + 0xd4);
                              fVar31 = *(float *)(ray + 0xd8);
                              fVar162 = auVar118._0_4_;
                              fVar164 = auVar118._4_4_;
                              auVar51._4_4_ = fVar164 * fVar25;
                              auVar51._0_4_ = fVar162 * fVar23;
                              fVar181 = auVar118._8_4_;
                              auVar51._8_4_ = fVar181 * fVar26;
                              fVar183 = auVar118._12_4_;
                              auVar51._12_4_ = fVar183 * fVar27;
                              fVar185 = auVar118._16_4_;
                              auVar51._16_4_ = fVar185 * fVar28;
                              fVar187 = auVar118._20_4_;
                              auVar51._20_4_ = fVar187 * fVar29;
                              fVar189 = auVar118._24_4_;
                              auVar51._24_4_ = fVar189 * fVar31;
                              auVar51._28_4_ = auVar135._28_4_;
                              auVar201 = vsubps_avx(auVar51,auVar50);
                              local_5920 = *(undefined1 (*) [32])ray;
                              auVar118 = vsubps_avx(auVar171,local_5920);
                              local_6080 = *(float *)(ray + 0x80);
                              fStack_607c = *(float *)(ray + 0x84);
                              fStack_6078 = *(float *)(ray + 0x88);
                              fStack_6074 = *(float *)(ray + 0x8c);
                              fStack_6070 = *(float *)(ray + 0x90);
                              fStack_606c = *(float *)(ray + 0x94);
                              fStack_6068 = *(float *)(ray + 0x98);
                              fVar159 = auVar118._0_4_;
                              fVar161 = auVar118._4_4_;
                              auVar52._4_4_ = fVar25 * fVar161;
                              auVar52._0_4_ = fVar23 * fVar159;
                              fVar250 = auVar118._8_4_;
                              auVar52._8_4_ = fVar26 * fVar250;
                              fVar13 = auVar118._12_4_;
                              auVar52._12_4_ = fVar27 * fVar13;
                              fVar18 = auVar118._16_4_;
                              auVar52._16_4_ = fVar28 * fVar18;
                              fVar24 = auVar118._20_4_;
                              auVar52._20_4_ = fVar29 * fVar24;
                              fVar30 = auVar118._24_4_;
                              auVar52._24_4_ = fVar31 * fVar30;
                              auVar52._28_4_ = auVar135._28_4_;
                              auVar225._0_4_ = fVar191 * local_6080;
                              auVar225._4_4_ = fVar207 * fStack_607c;
                              auVar225._8_4_ = fVar212 * fStack_6078;
                              auVar225._12_4_ = fVar213 * fStack_6074;
                              auVar225._16_4_ = fVar214 * fStack_6070;
                              auVar225._20_4_ = fVar215 * fStack_606c;
                              auVar225._24_4_ = fVar216 * fStack_6068;
                              auVar225._28_4_ = 0;
                              auVar32 = vsubps_avx(auVar225,auVar52);
                              auVar53._4_4_ = fVar164 * fStack_607c;
                              auVar53._0_4_ = fVar162 * local_6080;
                              auVar53._8_4_ = fVar181 * fStack_6078;
                              auVar53._12_4_ = fVar183 * fStack_6074;
                              auVar53._16_4_ = fVar185 * fStack_6070;
                              auVar53._20_4_ = fVar187 * fStack_606c;
                              auVar53._24_4_ = fVar189 * fStack_6068;
                              auVar53._28_4_ = 0;
                              auVar54._4_4_ = fVar161 * fVar16;
                              auVar54._0_4_ = fVar159 * fVar15;
                              auVar54._8_4_ = fVar250 * fVar17;
                              auVar54._12_4_ = fVar13 * fVar19;
                              auVar54._16_4_ = fVar18 * fVar20;
                              auVar54._20_4_ = fVar24 * fVar21;
                              auVar54._24_4_ = fVar30 * fVar22;
                              auVar54._28_4_ = fVar194;
                              local_5940 = vsubps_avx(auVar54,auVar53);
                              auVar117 = ZEXT416((uint)(fVar34 * fVar158 - fVar36 * fVar35));
                              auVar117 = vshufps_avx(auVar117,auVar117,0);
                              auVar226._16_16_ = auVar117;
                              auVar226._0_16_ = auVar117;
                              auVar108 = ZEXT416((uint)(fVar36 * fVar160 - fVar34 * fVar219));
                              auVar108 = vshufps_avx(auVar108,auVar108,0);
                              local_6180._16_16_ = auVar108;
                              local_6180._0_16_ = auVar108;
                              local_5d60 = *(undefined8 *)(ray + 0xc0);
                              uStack_5d58 = *(undefined8 *)(ray + 200);
                              uStack_5d50 = *(undefined8 *)(ray + 0xd0);
                              uStack_5d48 = *(undefined8 *)(ray + 0xd8);
                              fVar160 = auVar108._0_4_;
                              fVar249 = auVar108._4_4_;
                              fVar138 = auVar108._8_4_;
                              fVar14 = auVar108._12_4_;
                              local_6060 = *(undefined8 *)(ray + 0xa0);
                              uStack_6058 = *(undefined8 *)(ray + 0xa8);
                              uStack_6050 = *(undefined8 *)(ray + 0xb0);
                              uStack_6048 = *(undefined8 *)(ray + 0xb8);
                              fVar218 = auVar117._0_4_;
                              fVar227 = auVar117._4_4_;
                              fVar228 = auVar117._8_4_;
                              fVar229 = auVar117._12_4_;
                              auVar109 = vpermilps_avx(auVar145,0);
                              uStack_6064 = *(undefined4 *)(ray + 0x9c);
                              fVar217 = auVar109._0_4_;
                              fVar230 = auVar109._4_4_;
                              fVar237 = auVar109._8_4_;
                              auVar132._0_4_ =
                                   fVar217 * local_6080 + fVar218 * fVar15 + fVar23 * fVar160;
                              auVar132._4_4_ =
                                   fVar230 * fStack_607c + fVar227 * fVar16 + fVar25 * fVar249;
                              auVar132._8_4_ =
                                   fVar237 * fStack_6078 + fVar228 * fVar17 + fVar26 * fVar138;
                              auVar132._12_4_ =
                                   auVar109._12_4_ * fStack_6074 +
                                   fVar229 * fVar19 + fVar27 * fVar14;
                              auVar132._16_4_ =
                                   fVar217 * fStack_6070 + fVar218 * fVar20 + fVar28 * fVar160;
                              auVar132._20_4_ =
                                   fVar230 * fStack_606c + fVar227 * fVar21 + fVar29 * fVar249;
                              auVar132._24_4_ =
                                   fVar237 * fStack_6068 + fVar228 * fVar22 + fVar31 * fVar138;
                              auVar132._28_4_ = fVar194 + fVar14 + 0.0;
                              auVar117 = vshufps_avx(ZEXT416((uint)fVar219),ZEXT416((uint)fVar219),0
                                                    );
                              auVar108 = vshufps_avx(ZEXT416((uint)fVar158),ZEXT416((uint)fVar158),0
                                                    );
                              auVar145 = vshufps_avx(ZEXT416((uint)fVar36),ZEXT416((uint)fVar36),0);
                              auVar172._8_4_ = 0x80000000;
                              auVar172._0_8_ = 0x8000000080000000;
                              auVar172._12_4_ = 0x80000000;
                              auVar172._16_4_ = 0x80000000;
                              auVar172._20_4_ = 0x80000000;
                              auVar172._24_4_ = 0x80000000;
                              auVar172._28_4_ = 0x80000000;
                              auVar118 = vandps_avx(auVar132,auVar172);
                              uVar92 = auVar118._0_4_;
                              local_6000._0_4_ =
                                   uVar92 ^ (uint)(auVar201._0_4_ * auVar145._0_4_ +
                                                  auVar32._0_4_ * auVar117._0_4_ +
                                                  auVar108._0_4_ * local_5940._0_4_);
                              uVar182 = auVar118._4_4_;
                              local_6000._4_4_ =
                                   uVar182 ^ (uint)(auVar201._4_4_ * auVar145._4_4_ +
                                                   auVar32._4_4_ * auVar117._4_4_ +
                                                   auVar108._4_4_ * local_5940._4_4_);
                              uVar184 = auVar118._8_4_;
                              local_6000._8_4_ =
                                   uVar184 ^ (uint)(auVar201._8_4_ * auVar145._8_4_ +
                                                   auVar32._8_4_ * auVar117._8_4_ +
                                                   auVar108._8_4_ * local_5940._8_4_);
                              uVar186 = auVar118._12_4_;
                              local_6000._12_4_ =
                                   uVar186 ^ (uint)(auVar201._12_4_ * auVar145._12_4_ +
                                                   auVar32._12_4_ * auVar117._12_4_ +
                                                   auVar108._12_4_ * local_5940._12_4_);
                              uVar188 = auVar118._16_4_;
                              local_6000._16_4_ =
                                   uVar188 ^ (uint)(auVar201._16_4_ * auVar145._0_4_ +
                                                   auVar32._16_4_ * auVar117._0_4_ +
                                                   auVar108._0_4_ * local_5940._16_4_);
                              uVar190 = auVar118._20_4_;
                              local_6000._20_4_ =
                                   uVar190 ^ (uint)(auVar201._20_4_ * auVar145._4_4_ +
                                                   auVar32._20_4_ * auVar117._4_4_ +
                                                   auVar108._4_4_ * local_5940._20_4_);
                              uVar192 = auVar118._24_4_;
                              local_6000._24_4_ =
                                   uVar192 ^ (uint)(auVar201._24_4_ * auVar145._8_4_ +
                                                   auVar32._24_4_ * auVar117._8_4_ +
                                                   auVar108._8_4_ * local_5940._24_4_);
                              uVar193 = auVar118._28_4_;
                              local_6000._28_4_ =
                                   uVar193 ^ (uint)(auVar145._12_4_ +
                                                   auVar117._12_4_ + auVar108._12_4_);
                              auVar118 = vcmpps_avx(local_6000,_DAT_01faff00,5);
                              auVar37 = _local_61a0 & auVar118;
                              local_5e80 = pfVar98[-6];
                              fStack_5e7c = local_5e80;
                              fStack_5e78 = local_5e80;
                              fStack_5e74 = local_5e80;
                              fStack_5e70 = local_5e80;
                              fStack_5e6c = local_5e80;
                              fStack_5e68 = local_5e80;
                              fStack_5e64 = local_5e80;
                              local_58e0 = pfVar98[-5];
                              fStack_58dc = local_58e0;
                              fStack_58d8 = local_58e0;
                              fStack_58d4 = local_58e0;
                              fStack_58d0 = local_58e0;
                              fStack_58cc = local_58e0;
                              fStack_58c8 = local_58e0;
                              fStack_58c4 = local_58e0;
                              local_5900 = pfVar98[-4];
                              fStack_58fc = local_5900;
                              fStack_58f8 = local_5900;
                              fStack_58f4 = local_5900;
                              fStack_58f0 = local_5900;
                              fStack_58ec = local_5900;
                              fStack_58e8 = local_5900;
                              fStack_58e4 = local_5900;
                              local_5f60 = _local_6120;
                              if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar37 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar37 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar37 >> 0x7f,0) == '\0')
                                    && (auVar37 & (undefined1  [32])0x100000000) ==
                                       (undefined1  [32])0x0) && SUB321(auVar37 >> 0xbf,0) == '\0')
                                  && (auVar37 & (undefined1  [32])0x100000000) ==
                                     (undefined1  [32])0x0) && -1 < auVar37[0x1f]) {
LAB_01549b3e:
                                auVar235._8_8_ = uStack_5fb8;
                                auVar235._0_8_ = local_5fc0;
                                auVar235._16_8_ = uStack_5fb0;
                                auVar235._24_8_ = uStack_5fa8;
                                auVar163 = ZEXT436(auVar118._28_4_);
                                local_6180 = local_6040;
                                auVar226 = _local_5ee0;
                              }
                              else {
                                local_5d80 = auVar132;
                                auVar117 = vpermilps_avx(ZEXT416((uint)fVar34),0);
                                auVar108 = vpermilps_avx(local_6130,0);
                                auVar145 = vpermilps_avx(ZEXT416((uint)fVar35),0);
                                auVar118 = vandps_avx(auVar118,_local_61a0);
                                auVar247._0_4_ =
                                     uVar92 ^ (uint)(auVar201._0_4_ * auVar117._0_4_ +
                                                    auVar32._0_4_ * auVar108._0_4_ +
                                                    auVar145._0_4_ * local_5940._0_4_);
                                auVar247._4_4_ =
                                     uVar182 ^ (uint)(auVar201._4_4_ * auVar117._4_4_ +
                                                     auVar32._4_4_ * auVar108._4_4_ +
                                                     auVar145._4_4_ * local_5940._4_4_);
                                auVar247._8_4_ =
                                     uVar184 ^ (uint)(auVar201._8_4_ * auVar117._8_4_ +
                                                     auVar32._8_4_ * auVar108._8_4_ +
                                                     auVar145._8_4_ * local_5940._8_4_);
                                auVar247._12_4_ =
                                     uVar186 ^ (uint)(auVar201._12_4_ * auVar117._12_4_ +
                                                     auVar32._12_4_ * auVar108._12_4_ +
                                                     auVar145._12_4_ * local_5940._12_4_);
                                auVar247._16_4_ =
                                     uVar188 ^ (uint)(auVar201._16_4_ * auVar117._0_4_ +
                                                     auVar32._16_4_ * auVar108._0_4_ +
                                                     auVar145._0_4_ * local_5940._16_4_);
                                auVar247._20_4_ =
                                     uVar190 ^ (uint)(auVar201._20_4_ * auVar117._4_4_ +
                                                     auVar32._20_4_ * auVar108._4_4_ +
                                                     auVar145._4_4_ * local_5940._20_4_);
                                auVar247._24_4_ =
                                     uVar192 ^ (uint)(auVar201._24_4_ * auVar117._8_4_ +
                                                     auVar32._24_4_ * auVar108._8_4_ +
                                                     auVar145._8_4_ * local_5940._24_4_);
                                auVar247._28_4_ =
                                     uVar193 ^ (uint)(auVar132._28_4_ + local_5940._28_4_ + fVar229)
                                ;
                                auVar201 = vcmpps_avx(auVar247,_DAT_01faff00,5);
                                auVar32 = auVar118 & auVar201;
                                if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0 &&
                                         (auVar32 >> 0x3f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar32 >> 0x5f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar32 >> 0x7f,0) == '\0')
                                      && (auVar32 & (undefined1  [32])0x100000000) ==
                                         (undefined1  [32])0x0) && SUB321(auVar32 >> 0xbf,0) == '\0'
                                     ) && (auVar32 & (undefined1  [32])0x100000000) ==
                                          (undefined1  [32])0x0) && -1 < auVar32[0x1f])
                                goto LAB_01549b3e;
                                auVar178._8_4_ = 0x7fffffff;
                                auVar178._0_8_ = 0x7fffffff7fffffff;
                                auVar178._12_4_ = 0x7fffffff;
                                auVar178._16_4_ = 0x7fffffff;
                                auVar178._20_4_ = 0x7fffffff;
                                auVar178._24_4_ = 0x7fffffff;
                                auVar178._28_4_ = 0x7fffffff;
                                auVar32 = vandps_avx(auVar178,auVar132);
                                auVar118 = vandps_avx(auVar201,auVar118);
                                auVar201 = vsubps_avx(auVar32,local_6000);
                                auVar201 = vcmpps_avx(auVar201,auVar247,5);
                                auVar163 = ZEXT436((uint)auVar201._28_4_);
                                auVar37 = auVar118 & auVar201;
                                if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0 &&
                                         (auVar37 >> 0x3f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar37 >> 0x5f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar37 >> 0x7f,0) == '\0')
                                      && (auVar37 & (undefined1  [32])0x100000000) ==
                                         (undefined1  [32])0x0) && SUB321(auVar37 >> 0xbf,0) == '\0'
                                     ) && (auVar37 & (undefined1  [32])0x100000000) ==
                                          (undefined1  [32])0x0) && -1 < auVar37[0x1f]) {
                                  auVar235._8_8_ = uStack_5fb8;
                                  auVar235._0_8_ = local_5fc0;
                                  auVar235._16_8_ = uStack_5fb0;
                                  auVar235._24_8_ = uStack_5fa8;
                                  local_6180 = local_6040;
                                  auVar226 = _local_5ee0;
                                }
                                else {
                                  auVar118 = vandps_avx(auVar201,auVar118);
                                  fVar194 = (float)local_6040._28_4_ +
                                            (float)local_6040._28_4_ + auVar201._28_4_;
                                  local_5f60._0_4_ =
                                       uVar92 ^ (uint)(fVar159 * fVar217 +
                                                      fVar218 * fVar162 + fVar191 * fVar160);
                                  local_5f60._4_4_ =
                                       uVar182 ^ (uint)(fVar161 * fVar230 +
                                                       fVar227 * fVar164 + fVar207 * fVar249);
                                  local_5f60._8_4_ =
                                       uVar184 ^ (uint)(fVar250 * fVar237 +
                                                       fVar228 * fVar181 + fVar212 * fVar138);
                                  local_5f60._12_4_ =
                                       uVar186 ^ (uint)(fVar13 * auVar109._12_4_ +
                                                       fVar229 * fVar183 + fVar213 * fVar14);
                                  local_5f60._16_4_ =
                                       uVar188 ^ (uint)(fVar18 * fVar217 +
                                                       fVar218 * fVar185 + fVar214 * fVar160);
                                  local_5f60._20_4_ =
                                       uVar190 ^ (uint)(fVar24 * fVar230 +
                                                       fVar227 * fVar187 + fVar215 * fVar249);
                                  local_5f60._24_4_ =
                                       uVar192 ^ (uint)(fVar30 * fVar237 +
                                                       fVar228 * fVar189 + fVar216 * fVar138);
                                  local_5f60._28_4_ = uVar193 ^ (uint)fVar194;
                                  auVar75._4_4_ = auVar32._4_4_ * *(float *)(ray + 100);
                                  auVar75._0_4_ = auVar32._0_4_ * *(float *)(ray + 0x60);
                                  auVar75._8_4_ = auVar32._8_4_ * *(float *)(ray + 0x68);
                                  auVar75._12_4_ = auVar32._12_4_ * *(float *)(ray + 0x6c);
                                  auVar75._16_4_ = auVar32._16_4_ * *(float *)(ray + 0x70);
                                  auVar75._20_4_ = auVar32._20_4_ * *(float *)(ray + 0x74);
                                  auVar75._24_4_ = auVar32._24_4_ * *(float *)(ray + 0x78);
                                  auVar75._28_4_ = fVar194;
                                  auVar76._4_4_ = auVar32._4_4_ * *(float *)(ray + 0x104);
                                  auVar76._0_4_ = auVar32._0_4_ * *(float *)(ray + 0x100);
                                  auVar76._8_4_ = auVar32._8_4_ * *(float *)(ray + 0x108);
                                  auVar76._12_4_ = auVar32._12_4_ * *(float *)(ray + 0x10c);
                                  auVar76._16_4_ = auVar32._16_4_ * *(float *)(ray + 0x110);
                                  auVar76._20_4_ = auVar32._20_4_ * *(float *)(ray + 0x114);
                                  auVar76._24_4_ = auVar32._24_4_ * *(float *)(ray + 0x118);
                                  auVar76._28_4_ = local_6040._28_4_;
                                  auVar201 = vcmpps_avx(auVar75,local_5f60,1);
                                  auVar37 = vcmpps_avx(local_5f60,auVar76,2);
                                  auVar201 = vandps_avx(auVar37,auVar201);
                                  auVar37 = auVar118 & auVar201;
                                  if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (auVar37 >> 0x3f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar37 >> 0x5f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         SUB321(auVar37 >> 0x7f,0) != '\0') ||
                                        (auVar37 & (undefined1  [32])0x100000000) !=
                                        (undefined1  [32])0x0) || SUB321(auVar37 >> 0xbf,0) != '\0')
                                      || (auVar37 & (undefined1  [32])0x100000000) !=
                                         (undefined1  [32])0x0) || auVar37[0x1f] < '\0') {
                                    auVar118 = vandps_avx(auVar201,auVar118);
                                    auVar201 = vcmpps_avx(auVar132,_DAT_01faff00,4);
                                    auVar163 = ZEXT436(auVar201._28_4_);
                                    auVar37 = auVar118 & auVar201;
                                    if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0 ||
                                             (auVar37 >> 0x3f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar37 >> 0x5f & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           SUB321(auVar37 >> 0x7f,0) != '\0') ||
                                          (auVar37 & (undefined1  [32])0x100000000) !=
                                          (undefined1  [32])0x0) ||
                                         SUB321(auVar37 >> 0xbf,0) != '\0') ||
                                        (auVar37 & (undefined1  [32])0x100000000) !=
                                        (undefined1  [32])0x0) || auVar37[0x1f] < '\0') {
                                      auVar235 = vandps_avx(auVar201,auVar118);
                                      local_5ec0._0_8_ = auVar109._0_8_;
                                      local_5ec0._8_8_ = auVar109._8_8_;
                                      local_6020 = auVar32;
                                      _local_6100 = local_6000;
                                      local_6160 = auVar247;
                                      local_5fa0 = (undefined1  [8])local_5ec0._0_8_;
                                      uStack_5f98 = local_5ec0._8_8_;
                                      uStack_5f90 = local_5ec0._0_8_;
                                      uStack_5f88 = local_5ec0._8_8_;
                                      goto LAB_01549b4d;
                                    }
                                  }
                                  auVar163 = ZEXT436(auVar201._28_4_);
                                  auVar235._8_8_ = uStack_5fb8;
                                  auVar235._0_8_ = local_5fc0;
                                  auVar235._16_8_ = uStack_5fb0;
                                  auVar235._24_8_ = uStack_5fa8;
                                  local_6180 = local_6040;
                                  auVar226 = _local_5ee0;
                                  local_5f60 = _local_6120;
                                }
                              }
LAB_01549b4d:
                              auVar180 = ZEXT3264(local_5920);
                              local_5ec0._8_8_ = uStack_5f98;
                              local_5ec0._0_8_ = local_5fa0;
                              local_5ec0._16_8_ = uStack_5f90;
                              local_5ec0._24_8_ = uStack_5f88;
                              if ((((((((auVar235 >> 0x1f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar235 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar235 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar235 >> 0x7f,0) == '\0')
                                    && (auVar235 & (undefined1  [32])0x100000000) ==
                                       (undefined1  [32])0x0) && SUB321(auVar235 >> 0xbf,0) == '\0')
                                  && (auVar235 & (undefined1  [32])0x100000000) ==
                                     (undefined1  [32])0x0) && -1 < auVar235[0x1f]) {
                                local_6000 = _local_6100;
LAB_01549b93:
                                auVar5._4_4_ = local_5e80;
                                auVar5._0_4_ = local_5e80;
                                auVar5._8_4_ = local_5e80;
                                auVar5._12_4_ = local_5e80;
                                auVar5._16_4_ = local_5e80;
                                auVar5._20_4_ = local_5e80;
                                auVar5._24_4_ = local_5e80;
                                auVar5._28_4_ = local_5e80;
                                _local_6100 = auVar226;
                              }
                              else {
                                auVar116._0_4_ = (float)(int)(*(ushort *)(lVar12 + 8 + lVar101) - 1)
                                ;
                                auVar116._4_8_ = SUB128(ZEXT812(0),4);
                                auVar116._12_4_ = 0;
                                auVar117 = vrcpss_avx(auVar116,auVar116);
                                fVar194 = (float)(int)(*(ushort *)(lVar12 + 10 + lVar101) - 1);
                                auVar108 = ZEXT416((uint)(float)(int)(((uint)uVar100 & 1) + uVar93))
                                ;
                                auVar108 = vshufps_avx(auVar108,auVar108,0);
                                fVar219 = local_6020._0_4_;
                                fVar158 = local_6020._4_4_;
                                fVar159 = local_6020._8_4_;
                                fVar160 = local_6020._12_4_;
                                fVar161 = local_6020._16_4_;
                                fVar249 = local_6020._20_4_;
                                fVar250 = local_6020._24_4_;
                                auVar117 = ZEXT416((uint)(auVar117._0_4_ *
                                                         (2.0 - auVar117._0_4_ * auVar116._0_4_)));
                                auVar117 = vshufps_avx(auVar117,auVar117,0);
                                auVar55._4_4_ =
                                     (local_6100._4_4_ + fVar158 * auVar108._4_4_) * auVar117._4_4_;
                                auVar55._0_4_ =
                                     (local_6100._0_4_ + fVar219 * auVar108._0_4_) * auVar117._0_4_;
                                auVar55._8_4_ =
                                     (local_6100._8_4_ + fVar159 * auVar108._8_4_) * auVar117._8_4_;
                                auVar55._12_4_ =
                                     (local_6100._12_4_ + fVar160 * auVar108._12_4_) *
                                     auVar117._12_4_;
                                auVar55._16_4_ =
                                     (local_6100._16_4_ + fVar161 * auVar108._0_4_) * auVar117._0_4_
                                ;
                                auVar55._20_4_ =
                                     (local_6100._20_4_ + fVar249 * auVar108._4_4_) * auVar117._4_4_
                                ;
                                auVar55._24_4_ =
                                     (local_6100._24_4_ + fVar250 * auVar108._8_4_) * auVar117._8_4_
                                ;
                                auVar55._28_4_ = auVar117._12_4_;
                                auVar117 = vrcpss_avx(ZEXT416((uint)fVar194),ZEXT416((uint)fVar194))
                                ;
                                local_6000 = vblendvps_avx(_local_6100,auVar55,auVar235);
                                auVar108 = ZEXT416((uint)(float)(int)(((uint)(uVar100 >> 1) &
                                                                      0x7fffffff) + (int)fVar94));
                                auVar108 = vshufps_avx(auVar108,auVar108,0);
                                auVar117 = ZEXT416((uint)(auVar117._0_4_ *
                                                         (2.0 - auVar117._0_4_ * fVar194)));
                                auVar117 = vshufps_avx(auVar117,auVar117,0);
                                auVar56._4_4_ =
                                     (local_6160._4_4_ + fVar158 * auVar108._4_4_) * auVar117._4_4_;
                                auVar56._0_4_ =
                                     (local_6160._0_4_ + fVar219 * auVar108._0_4_) * auVar117._0_4_;
                                auVar56._8_4_ =
                                     (local_6160._8_4_ + fVar159 * auVar108._8_4_) * auVar117._8_4_;
                                auVar56._12_4_ =
                                     (local_6160._12_4_ + fVar160 * auVar108._12_4_) *
                                     auVar117._12_4_;
                                auVar56._16_4_ =
                                     (local_6160._16_4_ + fVar161 * auVar108._0_4_) * auVar117._0_4_
                                ;
                                auVar56._20_4_ =
                                     (local_6160._20_4_ + fVar249 * auVar108._4_4_) * auVar117._4_4_
                                ;
                                auVar56._24_4_ =
                                     (local_6160._24_4_ + fVar250 * auVar108._8_4_) * auVar117._8_4_
                                ;
                                auVar56._28_4_ = auVar117._12_4_;
                                local_6160 = vblendvps_avx(local_6160,auVar56,auVar235);
                                uVar182 = *(uint *)((long)&local_5e40 + uVar100 * 4);
                                pGVar8 = (context->scene->geometries).items[uVar182].ptr;
                                uVar92 = pGVar8->mask;
                                auVar133._4_4_ = uVar92;
                                auVar133._0_4_ = uVar92;
                                auVar133._8_4_ = uVar92;
                                auVar133._12_4_ = uVar92;
                                auVar133._16_4_ = uVar92;
                                auVar133._20_4_ = uVar92;
                                auVar133._24_4_ = uVar92;
                                auVar133._28_4_ = uVar92;
                                auVar118 = vandps_avx(auVar133,*(undefined1 (*) [32])(ray + 0x120));
                                auVar117 = vpcmpeqd_avx(auVar118._16_16_,ZEXT416(0) << 0x20);
                                auVar108 = vpcmpeqd_avx(auVar118._0_16_,ZEXT416(0) << 0x20);
                                auVar151._16_16_ = auVar117;
                                auVar151._0_16_ = auVar108;
                                uVar92 = auVar117._12_4_;
                                auVar163 = ZEXT436(uVar92);
                                auVar118 = vblendps_avx(ZEXT1632(auVar108),auVar151,0xf0);
                                auVar201 = auVar235 & ~auVar118;
                                if ((((((((auVar201 >> 0x1f & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0 &&
                                         (auVar201 >> 0x3f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar201 >> 0x5f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar201 >> 0x7f,0) == '\0'
                                       ) && (auVar201 & (undefined1  [32])0x100000000) ==
                                            (undefined1  [32])0x0) &&
                                     SUB321(auVar201 >> 0xbf,0) == '\0') &&
                                    (auVar201 & (undefined1  [32])0x100000000) ==
                                    (undefined1  [32])0x0) && -1 < auVar201[0x1f])
                                goto LAB_01549b93;
                                local_6130._8_8_ = 0;
                                local_6130._0_8_ = uVar100;
                                auVar236 = vandnps_avx(auVar118,auVar235);
                                auVar117 = auVar236._0_16_;
                                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                                   (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                                  auVar5._4_4_ = local_5e80;
                                  auVar5._0_4_ = local_5e80;
                                  auVar5._8_4_ = local_5e80;
                                  auVar5._12_4_ = local_5e80;
                                  auVar5._16_4_ = local_5e80;
                                  auVar5._20_4_ = local_5e80;
                                  auVar5._24_4_ = local_5e80;
                                  auVar5._28_4_ = local_5e80;
                                  _local_6100 = auVar226;
                                }
                                else {
                                  local_6060 = CONCAT44(fVar16,uVar93);
                                  auVar135 = vrcpps_avx(local_6020);
                                  fVar194 = auVar135._0_4_;
                                  fVar138 = auVar135._4_4_;
                                  auVar69._4_4_ = fVar158 * fVar138;
                                  auVar69._0_4_ = fVar219 * fVar194;
                                  fVar219 = auVar135._8_4_;
                                  auVar69._8_4_ = fVar159 * fVar219;
                                  fVar158 = auVar135._12_4_;
                                  auVar69._12_4_ = fVar160 * fVar158;
                                  fVar159 = auVar135._16_4_;
                                  auVar69._16_4_ = fVar161 * fVar159;
                                  fVar160 = auVar135._20_4_;
                                  auVar69._20_4_ = fVar249 * fVar160;
                                  fVar161 = auVar135._24_4_;
                                  auVar69._24_4_ = fVar250 * fVar161;
                                  auVar69._28_4_ = uVar92;
                                  auVar175._8_4_ = 0x3f800000;
                                  auVar175._0_8_ = 0x3f8000003f800000;
                                  auVar175._12_4_ = 0x3f800000;
                                  auVar175._16_4_ = 0x3f800000;
                                  auVar175._20_4_ = 0x3f800000;
                                  auVar175._24_4_ = 0x3f800000;
                                  auVar175._28_4_ = 0x3f800000;
                                  auVar202 = vsubps_avx(auVar175,auVar69);
                                  fVar194 = fVar194 + fVar194 * auVar202._0_4_;
                                  fVar138 = fVar138 + fVar138 * auVar202._4_4_;
                                  fVar219 = fVar219 + fVar219 * auVar202._8_4_;
                                  fVar158 = fVar158 + fVar158 * auVar202._12_4_;
                                  fVar159 = fVar159 + fVar159 * auVar202._16_4_;
                                  fVar160 = fVar160 + fVar160 * auVar202._20_4_;
                                  fVar161 = fVar161 + fVar161 * auVar202._24_4_;
                                  pRVar11 = context->user;
                                  local_5ab0 = vpshufd_avx(ZEXT416(uVar182),0);
                                  local_5ad0 = vpshufd_avx(ZEXT416(*(uint *)((long)&local_5e60 +
                                                                            uVar100 * 4)),0);
                                  uStack_5b78 = uStack_5f98;
                                  local_5b80 = local_5fa0;
                                  uStack_5b70 = uStack_5f90;
                                  uStack_5b68 = uStack_5f88;
                                  _local_5b60 = auVar226;
                                  local_5b40 = local_6180._0_8_;
                                  uStack_5b38 = local_6180._8_8_;
                                  uStack_5b30 = local_6180._16_8_;
                                  uStack_5b28 = local_6180._24_8_;
                                  local_5b20 = local_6000._0_4_ * fVar194;
                                  fStack_5b1c = local_6000._4_4_ * fVar138;
                                  fStack_5b18 = local_6000._8_4_ * fVar219;
                                  fStack_5b14 = local_6000._12_4_ * fVar158;
                                  fStack_5b10 = local_6000._16_4_ * fVar159;
                                  fStack_5b0c = local_6000._20_4_ * fVar160;
                                  fStack_5b08 = local_6000._24_4_ * fVar161;
                                  fStack_5b04 = auVar202._28_4_;
                                  local_5b00 = local_6160._0_4_ * fVar194;
                                  fStack_5afc = local_6160._4_4_ * fVar138;
                                  fStack_5af8 = local_6160._8_4_ * fVar219;
                                  fStack_5af4 = local_6160._12_4_ * fVar158;
                                  fStack_5af0 = local_6160._16_4_ * fVar159;
                                  fStack_5aec = local_6160._20_4_ * fVar160;
                                  fStack_5ae8 = local_6160._24_4_ * fVar161;
                                  uStack_5ae4 = 0x3f800000;
                                  local_5ae0 = local_5ad0;
                                  local_5ac0 = local_5ab0;
                                  local_5fd0[1] = local_5f80;
                                  *local_5fd0 = local_5f80;
                                  local_5aa0 = pRVar11->instID[0];
                                  auVar70._4_4_ = local_5f60._4_4_ * fVar138;
                                  auVar70._0_4_ = local_5f60._0_4_ * fVar194;
                                  auVar70._8_4_ = local_5f60._8_4_ * fVar219;
                                  auVar70._12_4_ = local_5f60._12_4_ * fVar158;
                                  auVar70._16_4_ = local_5f60._16_4_ * fVar159;
                                  auVar70._20_4_ = local_5f60._20_4_ * fVar160;
                                  auVar70._24_4_ = local_5f60._24_4_ * fVar161;
                                  auVar70._28_4_ = auVar135._28_4_ + auVar202._28_4_;
                                  uStack_5a9c = local_5aa0;
                                  uStack_5a98 = local_5aa0;
                                  uStack_5a94 = local_5aa0;
                                  uStack_5a90 = local_5aa0;
                                  uStack_5a8c = local_5aa0;
                                  uStack_5a88 = local_5aa0;
                                  uStack_5a84 = local_5aa0;
                                  local_5a80 = pRVar11->instPrimID[0];
                                  uStack_5a7c = local_5a80;
                                  uStack_5a78 = local_5a80;
                                  uStack_5a74 = local_5a80;
                                  uStack_5a70 = local_5a80;
                                  uStack_5a6c = local_5a80;
                                  uStack_5a68 = local_5a80;
                                  uStack_5a64 = local_5a80;
                                  _local_5fa0 = *(undefined1 (*) [32])(ray + 0x100);
                                  auVar135 = vblendvps_avx(_local_5fa0,auVar70,auVar236);
                                  *(undefined1 (*) [32])(ray + 0x100) = auVar135;
                                  _local_60e0 = auVar236;
                                  local_60c0 = (undefined1  [8])local_60e0;
                                  uStack_60b8 = pGVar8->userPtr;
                                  uStack_60b0 = context->user;
                                  uStack_60a8 = ray;
                                  local_60a0 = (RTCHitN *)local_5b80;
                                  local_6098 = 8;
                                  local_6080 = fVar94;
                                  if (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0) {
                                    auVar108 = auVar236._16_16_;
                                    _local_6100 = auVar226;
                                  }
                                  else {
                                    _local_6100 = auVar226;
                                    (*pGVar8->occlusionFilterN)
                                              ((RTCFilterFunctionNArguments *)local_60c0);
                                    auVar108 = _auStack_60d0;
                                    auVar117 = _local_60e0;
                                  }
                                  auVar145 = vpcmpeqd_avx(auVar117,ZEXT816(0) << 0x40);
                                  auVar109 = vpcmpeqd_avx(auVar108,ZEXT816(0) << 0x40);
                                  auVar153._16_16_ = auVar109;
                                  auVar153._0_16_ = auVar145;
                                  auVar135 = local_5f80 & ~auVar153;
                                  fVar94 = local_6080;
                                  uVar93 = (uint)(float)local_6060;
                                  if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0 &&
                                           (auVar135 >> 0x3f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar135 >> 0x5f & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar135 >> 0x7f,0) == '\0') &&
                                        (auVar135 & (undefined1  [32])0x100000000) ==
                                        (undefined1  [32])0x0) && SUB321(auVar135 >> 0xbf,0) == '\0'
                                       ) && (auVar135 & (undefined1  [32])0x100000000) ==
                                            (undefined1  [32])0x0) && -1 < auVar135[0x1f]) {
                                    auVar236._0_4_ = auVar145._0_4_ ^ local_5f80._0_4_;
                                    auVar236._4_4_ = auVar145._4_4_ ^ local_5f80._4_4_;
                                    auVar236._8_4_ = auVar145._8_4_ ^ local_5f80._8_4_;
                                    auVar236._12_4_ = auVar145._12_4_ ^ local_5f80._12_4_;
                                    auVar236._16_4_ = auVar109._0_4_ ^ local_5f80._16_4_;
                                    auVar236._20_4_ = auVar109._4_4_ ^ local_5f80._20_4_;
                                    auVar236._24_4_ = auVar109._8_4_ ^ local_5f80._24_4_;
                                    auVar236._28_4_ = auVar109._12_4_ ^ local_5f80._28_4_;
                                  }
                                  else {
                                    p_Var10 = context->args->filter;
                                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                                       (((context->args->flags &
                                         RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                                      (*p_Var10)((RTCFilterFunctionNArguments *)local_60c0);
                                      fVar94 = local_6080;
                                      auVar108 = _auStack_60d0;
                                      auVar117 = _local_60e0;
                                      uVar93 = (uint)(float)local_6060;
                                    }
                                    auVar117 = vpcmpeqd_avx(auVar117,(undefined1  [16])0x0);
                                    auVar108 = vpcmpeqd_avx(auVar108,(undefined1  [16])0x0);
                                    auVar137._16_16_ = auVar108;
                                    auVar137._0_16_ = auVar117;
                                    auVar236._0_4_ = auVar117._0_4_ ^ local_5f80._0_4_;
                                    auVar236._4_4_ = auVar117._4_4_ ^ local_5f80._4_4_;
                                    auVar236._8_4_ = auVar117._8_4_ ^ local_5f80._8_4_;
                                    auVar236._12_4_ = auVar117._12_4_ ^ local_5f80._12_4_;
                                    auVar236._16_4_ = auVar108._0_4_ ^ local_5f80._16_4_;
                                    auVar236._20_4_ = auVar108._4_4_ ^ local_5f80._20_4_;
                                    auVar236._24_4_ = auVar108._8_4_ ^ local_5f80._24_4_;
                                    auVar236._28_4_ = auVar108._12_4_ ^ local_5f80._28_4_;
                                    auVar153._8_4_ = 0xff800000;
                                    auVar153._0_8_ = 0xff800000ff800000;
                                    auVar153._12_4_ = 0xff800000;
                                    auVar153._16_4_ = 0xff800000;
                                    auVar153._20_4_ = 0xff800000;
                                    auVar153._24_4_ = 0xff800000;
                                    auVar153._28_4_ = 0xff800000;
                                    auVar135 = vblendvps_avx(auVar153,*(undefined1 (*) [32])
                                                                       (uStack_60a8 + 0x100),
                                                             auVar137);
                                    *(undefined1 (*) [32])(uStack_60a8 + 0x100) = auVar135;
                                  }
                                  uVar92 = auVar153._28_4_;
                                  auVar135 = vblendvps_avx(_local_5fa0,
                                                           *(undefined1 (*) [32])(ray + 0x100),
                                                           auVar236);
                                  *(undefined1 (*) [32])(ray + 0x100) = auVar135;
                                  auVar180 = ZEXT3264(*(undefined1 (*) [32])ray);
                                  auVar135 = *(undefined1 (*) [32])(ray + 0x20);
                                  auVar202 = *(undefined1 (*) [32])(ray + 0x40);
                                  local_6080 = (float)*(undefined8 *)(ray + 0x80);
                                  fStack_607c = (float)((ulong)*(undefined8 *)(ray + 0x80) >> 0x20);
                                  fStack_6078 = (float)*(undefined8 *)(ray + 0x88);
                                  fStack_6074 = (float)((ulong)*(undefined8 *)(ray + 0x88) >> 0x20);
                                  fStack_6070 = (float)*(undefined8 *)(ray + 0x90);
                                  fStack_606c = (float)((ulong)*(undefined8 *)(ray + 0x90) >> 0x20);
                                  fStack_6068 = (float)*(undefined8 *)(ray + 0x98);
                                  uStack_6064 = (undefined4)
                                                ((ulong)*(undefined8 *)(ray + 0x98) >> 0x20);
                                  local_6060 = *(undefined8 *)(ray + 0xa0);
                                  uStack_6058 = *(undefined8 *)(ray + 0xa8);
                                  uStack_6050 = *(undefined8 *)(ray + 0xb0);
                                  uStack_6048 = *(undefined8 *)(ray + 0xb8);
                                  local_5d60 = *(undefined8 *)(ray + 0xc0);
                                  uStack_5d58 = *(undefined8 *)(ray + 200);
                                  uStack_5d50 = *(undefined8 *)(ray + 0xd0);
                                  uStack_5d48 = *(undefined8 *)(ray + 0xd8);
                                  auVar5._4_4_ = fStack_5e7c;
                                  auVar5._0_4_ = local_5e80;
                                  auVar5._8_4_ = fStack_5e78;
                                  auVar5._12_4_ = fStack_5e74;
                                  auVar5._16_4_ = fStack_5e70;
                                  auVar5._20_4_ = fStack_5e6c;
                                  auVar5._24_4_ = fStack_5e68;
                                  auVar5._28_4_ = fStack_5e64;
                                  uVar100 = local_6130._0_8_;
                                }
                                auVar163 = ZEXT436(uVar92);
                                _local_61a0 = vandnps_avx(auVar236,_local_61a0);
                              }
                              auVar146 = _local_5de0;
                              auVar85._4_4_ = fStack_58dc;
                              auVar85._0_4_ = local_58e0;
                              auVar85._8_4_ = fStack_58d8;
                              auVar85._12_4_ = fStack_58d4;
                              auVar85._16_4_ = fStack_58d0;
                              auVar85._20_4_ = fStack_58cc;
                              auVar85._24_4_ = fStack_58c8;
                              auVar85._28_4_ = fStack_58c4;
                              auVar87._4_4_ = fStack_589c;
                              auVar87._0_4_ = local_58a0;
                              auVar87._8_4_ = fStack_5898;
                              auVar87._12_4_ = fStack_5894;
                              auVar87._16_4_ = fStack_5890;
                              auVar87._20_4_ = fStack_588c;
                              auVar87._24_4_ = fStack_5888;
                              auVar87._28_4_ = fStack_5884;
                              auVar118 = vsubps_avx(auVar85,auVar87);
                              auVar84._4_4_ = fStack_58fc;
                              auVar84._0_4_ = local_5900;
                              auVar84._8_4_ = fStack_58f8;
                              auVar84._12_4_ = fStack_58f4;
                              auVar84._16_4_ = fStack_58f0;
                              auVar84._20_4_ = fStack_58ec;
                              auVar84._24_4_ = fStack_58e8;
                              auVar84._28_4_ = fStack_58e4;
                              auVar86._4_4_ = fStack_58bc;
                              auVar86._0_4_ = local_58c0;
                              auVar86._8_4_ = fStack_58b8;
                              auVar86._12_4_ = fStack_58b4;
                              auVar86._16_4_ = fStack_58b0;
                              auVar86._20_4_ = fStack_58ac;
                              auVar86._24_4_ = fStack_58a8;
                              auVar86._28_4_ = fStack_58a4;
                              auVar201 = vsubps_avx(auVar84,auVar86);
                              auVar90._4_4_ = fStack_583c;
                              auVar90._0_4_ = local_5840;
                              auVar90._8_4_ = fStack_5838;
                              auVar90._12_4_ = fStack_5834;
                              auVar90._16_4_ = fStack_5830;
                              auVar90._20_4_ = fStack_582c;
                              auVar90._24_4_ = fStack_5828;
                              auVar90._28_4_ = fStack_5824;
                              auVar32 = vsubps_avx(auVar90,auVar85);
                              auVar89._4_4_ = fStack_585c;
                              auVar89._0_4_ = local_5860;
                              auVar89._8_4_ = fStack_5858;
                              auVar89._12_4_ = fStack_5854;
                              auVar89._16_4_ = fStack_5850;
                              auVar89._20_4_ = fStack_584c;
                              auVar89._24_4_ = fStack_5848;
                              auVar89._28_4_ = fStack_5844;
                              auVar37 = vsubps_avx(auVar89,auVar84);
                              fVar194 = auVar118._0_4_;
                              fVar252 = auVar37._0_4_;
                              fVar161 = auVar118._4_4_;
                              fVar254 = auVar37._4_4_;
                              auVar57._4_4_ = fVar254 * fVar161;
                              auVar57._0_4_ = fVar252 * fVar194;
                              fVar14 = auVar118._8_4_;
                              fVar255 = auVar37._8_4_;
                              auVar57._8_4_ = fVar255 * fVar14;
                              fVar35 = auVar118._12_4_;
                              fVar256 = auVar37._12_4_;
                              auVar57._12_4_ = fVar256 * fVar35;
                              fVar19 = auVar118._16_4_;
                              fVar257 = auVar37._16_4_;
                              auVar57._16_4_ = fVar257 * fVar19;
                              fVar25 = auVar118._20_4_;
                              fVar258 = auVar37._20_4_;
                              auVar57._20_4_ = fVar258 * fVar25;
                              fVar31 = auVar118._24_4_;
                              fVar259 = auVar37._24_4_;
                              auVar57._24_4_ = fVar259 * fVar31;
                              auVar57._28_4_ = fStack_5844;
                              fVar219 = auVar201._0_4_;
                              fVar164 = auVar32._0_4_;
                              auVar211._0_4_ = fVar164 * fVar219;
                              fVar249 = auVar201._4_4_;
                              fVar181 = auVar32._4_4_;
                              auVar211._4_4_ = fVar181 * fVar249;
                              fVar18 = auVar201._8_4_;
                              fVar183 = auVar32._8_4_;
                              auVar211._8_4_ = fVar183 * fVar18;
                              fVar36 = auVar201._12_4_;
                              fVar185 = auVar32._12_4_;
                              auVar211._12_4_ = fVar185 * fVar36;
                              fVar20 = auVar201._16_4_;
                              fVar187 = auVar32._16_4_;
                              auVar211._16_4_ = fVar187 * fVar20;
                              fVar26 = auVar201._20_4_;
                              fVar189 = auVar32._20_4_;
                              auVar211._20_4_ = fVar189 * fVar26;
                              fVar218 = auVar201._24_4_;
                              fVar191 = auVar32._24_4_;
                              auVar211._24_4_ = fVar191 * fVar218;
                              auVar211._28_36_ = auVar163;
                              _local_5fa0 = vsubps_avx(auVar211._0_32_,auVar57);
                              auVar88._4_4_ = fStack_587c;
                              auVar88._0_4_ = local_5880;
                              auVar88._8_4_ = fStack_5878;
                              auVar88._12_4_ = fStack_5874;
                              auVar88._16_4_ = fStack_5870;
                              auVar88._20_4_ = fStack_586c;
                              auVar88._24_4_ = fStack_5868;
                              auVar88._28_4_ = fStack_5864;
                              auVar118 = vsubps_avx(auVar5,auVar88);
                              auVar33 = vsubps_avx(_local_5de0,auVar5);
                              _local_5de0 = auVar201;
                              fVar260 = auVar33._0_4_;
                              fVar262 = auVar33._4_4_;
                              auVar58._4_4_ = fVar262 * fVar249;
                              auVar58._0_4_ = fVar260 * fVar219;
                              fVar263 = auVar33._8_4_;
                              auVar58._8_4_ = fVar263 * fVar18;
                              fVar264 = auVar33._12_4_;
                              auVar58._12_4_ = fVar264 * fVar36;
                              fVar265 = auVar33._16_4_;
                              auVar58._16_4_ = fVar265 * fVar20;
                              fVar266 = auVar33._20_4_;
                              auVar58._20_4_ = fVar266 * fVar26;
                              fVar162 = auVar146._28_4_;
                              fVar267 = auVar33._24_4_;
                              auVar58._24_4_ = fVar267 * fVar218;
                              auVar58._28_4_ = fVar162;
                              fVar158 = auVar118._0_4_;
                              fVar250 = auVar118._4_4_;
                              auVar59._4_4_ = fVar254 * fVar250;
                              auVar59._0_4_ = fVar252 * fVar158;
                              fVar24 = auVar118._8_4_;
                              auVar59._8_4_ = fVar255 * fVar24;
                              fVar15 = auVar118._12_4_;
                              auVar59._12_4_ = fVar256 * fVar15;
                              fVar21 = auVar118._16_4_;
                              auVar59._16_4_ = fVar257 * fVar21;
                              fVar27 = auVar118._20_4_;
                              auVar59._20_4_ = fVar258 * fVar27;
                              fVar227 = auVar118._24_4_;
                              auVar59._24_4_ = fVar259 * fVar227;
                              auVar59._28_4_ = auVar163._0_4_;
                              auVar118 = vsubps_avx(auVar59,auVar58);
                              auVar211 = ZEXT3264(auVar118);
                              auVar60._4_4_ = fVar250 * fVar181;
                              auVar60._0_4_ = fVar158 * fVar164;
                              auVar60._8_4_ = fVar24 * fVar183;
                              auVar60._12_4_ = fVar15 * fVar185;
                              auVar60._16_4_ = fVar21 * fVar187;
                              auVar60._20_4_ = fVar27 * fVar189;
                              auVar60._24_4_ = fVar227 * fVar191;
                              auVar60._28_4_ = fVar162;
                              auVar61._4_4_ = fVar262 * fVar161;
                              auVar61._0_4_ = fVar260 * fVar194;
                              auVar61._8_4_ = fVar263 * fVar14;
                              auVar61._12_4_ = fVar264 * fVar35;
                              auVar61._16_4_ = fVar265 * fVar19;
                              auVar61._20_4_ = fVar266 * fVar25;
                              auVar61._24_4_ = fVar267 * fVar31;
                              auVar61._28_4_ = auVar163._0_4_;
                              local_6040 = vsubps_avx(auVar61,auVar60);
                              auVar201 = vsubps_avx(auVar5,auVar180._0_32_);
                              auVar33 = vsubps_avx(auVar85,auVar135);
                              auVar146 = vsubps_avx(auVar84,auVar202);
                              fVar230 = auVar146._0_4_;
                              fVar237 = auVar146._4_4_;
                              auVar62._4_4_ = fVar237 * local_6060._4_4_;
                              auVar62._0_4_ = fVar230 * (float)local_6060;
                              fVar238 = auVar146._8_4_;
                              auVar62._8_4_ = fVar238 * (float)uStack_6058;
                              fVar239 = auVar146._12_4_;
                              auVar62._12_4_ = fVar239 * uStack_6058._4_4_;
                              fVar240 = auVar146._16_4_;
                              auVar62._16_4_ = fVar240 * (float)uStack_6050;
                              fVar241 = auVar146._20_4_;
                              auVar62._20_4_ = fVar241 * uStack_6050._4_4_;
                              fVar242 = auVar146._24_4_;
                              auVar62._24_4_ = fVar242 * (float)uStack_6048;
                              auVar62._28_4_ = fVar162;
                              fVar159 = auVar33._0_4_;
                              fVar138 = auVar33._4_4_;
                              auVar63._4_4_ = local_5d60._4_4_ * fVar138;
                              auVar63._0_4_ = (float)local_5d60 * fVar159;
                              fVar30 = auVar33._8_4_;
                              auVar63._8_4_ = (float)uStack_5d58 * fVar30;
                              fVar16 = auVar33._12_4_;
                              auVar63._12_4_ = uStack_5d58._4_4_ * fVar16;
                              fVar22 = auVar33._16_4_;
                              auVar63._16_4_ = (float)uStack_5d50 * fVar22;
                              fVar28 = auVar33._20_4_;
                              auVar63._20_4_ = uStack_5d50._4_4_ * fVar28;
                              fVar228 = auVar33._24_4_;
                              auVar63._24_4_ = (float)uStack_5d48 * fVar228;
                              auVar63._28_4_ = auVar135._28_4_;
                              auVar146 = vsubps_avx(auVar63,auVar62);
                              fVar160 = auVar201._0_4_;
                              fVar13 = auVar201._4_4_;
                              auVar64._4_4_ = local_5d60._4_4_ * fVar13;
                              auVar64._0_4_ = (float)local_5d60 * fVar160;
                              fVar34 = auVar201._8_4_;
                              auVar64._8_4_ = (float)uStack_5d58 * fVar34;
                              fVar17 = auVar201._12_4_;
                              auVar64._12_4_ = uStack_5d58._4_4_ * fVar17;
                              fVar23 = auVar201._16_4_;
                              auVar64._16_4_ = (float)uStack_5d50 * fVar23;
                              fVar29 = auVar201._20_4_;
                              auVar64._20_4_ = uStack_5d50._4_4_ * fVar29;
                              fVar229 = auVar201._24_4_;
                              auVar64._24_4_ = (float)uStack_5d48 * fVar229;
                              auVar64._28_4_ = fVar162;
                              auVar65._4_4_ = fStack_607c * fVar237;
                              auVar65._0_4_ = local_6080 * fVar230;
                              auVar65._8_4_ = fStack_6078 * fVar238;
                              auVar65._12_4_ = fStack_6074 * fVar239;
                              auVar65._16_4_ = fStack_6070 * fVar240;
                              auVar65._20_4_ = fStack_606c * fVar241;
                              auVar65._24_4_ = fStack_6068 * fVar242;
                              auVar65._28_4_ = auVar202._28_4_;
                              auVar202 = vsubps_avx(auVar65,auVar64);
                              auVar66._4_4_ = fStack_607c * fVar138;
                              auVar66._0_4_ = local_6080 * fVar159;
                              auVar66._8_4_ = fStack_6078 * fVar30;
                              auVar66._12_4_ = fStack_6074 * fVar16;
                              auVar66._16_4_ = fStack_6070 * fVar22;
                              auVar66._20_4_ = fStack_606c * fVar28;
                              auVar66._24_4_ = fStack_6068 * fVar228;
                              auVar66._28_4_ = fVar162;
                              auVar157._0_4_ = fVar160 * (float)local_6060;
                              auVar157._4_4_ = fVar13 * local_6060._4_4_;
                              auVar157._8_4_ = fVar34 * (float)uStack_6058;
                              auVar157._12_4_ = fVar17 * uStack_6058._4_4_;
                              auVar157._16_4_ = fVar23 * (float)uStack_6050;
                              auVar157._20_4_ = fVar29 * uStack_6050._4_4_;
                              auVar157._28_36_ = auVar180._28_36_;
                              auVar157._24_4_ = fVar229 * (float)uStack_6048;
                              auVar203 = vsubps_avx(auVar157._0_32_,auVar66);
                              fVar207 = auVar118._0_4_;
                              fVar212 = auVar118._4_4_;
                              fVar213 = auVar118._8_4_;
                              fVar214 = auVar118._12_4_;
                              fVar215 = auVar118._16_4_;
                              fVar216 = auVar118._20_4_;
                              fVar217 = auVar118._24_4_;
                              auVar134._0_4_ =
                                   local_6080 * (float)local_5fa0._0_4_ +
                                   fVar207 * (float)local_6060 +
                                   (float)local_5d60 * local_6040._0_4_;
                              auVar134._4_4_ =
                                   fStack_607c * (float)local_5fa0._4_4_ +
                                   fVar212 * local_6060._4_4_ + local_5d60._4_4_ * local_6040._4_4_;
                              auVar134._8_4_ =
                                   fStack_6078 * (float)uStack_5f98 +
                                   fVar213 * (float)uStack_6058 +
                                   (float)uStack_5d58 * local_6040._8_4_;
                              auVar134._12_4_ =
                                   fStack_6074 * uStack_5f98._4_4_ +
                                   fVar214 * uStack_6058._4_4_ +
                                   uStack_5d58._4_4_ * local_6040._12_4_;
                              auVar134._16_4_ =
                                   fStack_6070 * (float)uStack_5f90 +
                                   fVar215 * (float)uStack_6050 +
                                   (float)uStack_5d50 * local_6040._16_4_;
                              auVar134._20_4_ =
                                   fStack_606c * uStack_5f90._4_4_ +
                                   fVar216 * uStack_6050._4_4_ +
                                   uStack_5d50._4_4_ * local_6040._20_4_;
                              auVar134._24_4_ =
                                   fStack_6068 * (float)uStack_5f88 +
                                   fVar217 * (float)uStack_6048 +
                                   (float)uStack_5d48 * local_6040._24_4_;
                              auVar134._28_4_ = uStack_6048._4_4_ + uStack_6048._4_4_ + fVar162;
                              auVar173._8_4_ = 0x80000000;
                              auVar173._0_8_ = 0x8000000080000000;
                              auVar173._12_4_ = 0x80000000;
                              auVar173._16_4_ = 0x80000000;
                              auVar173._20_4_ = 0x80000000;
                              auVar173._24_4_ = 0x80000000;
                              auVar173._28_4_ = 0x80000000;
                              auVar135 = vandps_avx(auVar134,auVar173);
                              auVar117 = auVar135._0_16_;
                              uVar92 = auVar135._0_4_;
                              auVar253._0_4_ =
                                   uVar92 ^ (uint)(fVar260 * auVar146._0_4_ +
                                                  auVar202._0_4_ * fVar164 +
                                                  fVar252 * auVar203._0_4_);
                              uVar182 = auVar135._4_4_;
                              auVar253._4_4_ =
                                   uVar182 ^ (uint)(fVar262 * auVar146._4_4_ +
                                                   auVar202._4_4_ * fVar181 +
                                                   fVar254 * auVar203._4_4_);
                              uVar184 = auVar135._8_4_;
                              auVar253._8_4_ =
                                   uVar184 ^ (uint)(fVar263 * auVar146._8_4_ +
                                                   auVar202._8_4_ * fVar183 +
                                                   fVar255 * auVar203._8_4_);
                              uVar186 = auVar135._12_4_;
                              auVar253._12_4_ =
                                   uVar186 ^ (uint)(fVar264 * auVar146._12_4_ +
                                                   auVar202._12_4_ * fVar185 +
                                                   fVar256 * auVar203._12_4_);
                              uVar188 = auVar135._16_4_;
                              auVar253._16_4_ =
                                   uVar188 ^ (uint)(fVar265 * auVar146._16_4_ +
                                                   auVar202._16_4_ * fVar187 +
                                                   fVar257 * auVar203._16_4_);
                              uVar190 = auVar135._20_4_;
                              auVar253._20_4_ =
                                   uVar190 ^ (uint)(fVar266 * auVar146._20_4_ +
                                                   auVar202._20_4_ * fVar189 +
                                                   fVar258 * auVar203._20_4_);
                              uVar192 = auVar135._24_4_;
                              auVar253._24_4_ =
                                   uVar192 ^ (uint)(fVar267 * auVar146._24_4_ +
                                                   auVar202._24_4_ * fVar191 +
                                                   fVar259 * auVar203._24_4_);
                              uVar193 = auVar135._28_4_;
                              auVar253._28_4_ =
                                   uVar193 ^ (uint)(auVar37._28_4_ +
                                                   auVar32._28_4_ + uStack_6048._4_4_);
                              auVar135 = vcmpps_avx(auVar253,_DAT_01faff00,5);
                              auVar32 = _local_61a0 & auVar135;
                              if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar32 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar32 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar32 >> 0x7f,0) == '\0')
                                    && (auVar32 & (undefined1  [32])0x100000000) ==
                                       (undefined1  [32])0x0) && SUB321(auVar32 >> 0xbf,0) == '\0')
                                  && (auVar32 & (undefined1  [32])0x100000000) ==
                                     (undefined1  [32])0x0) && -1 < auVar32[0x1f]) {
                                auVar157 = ZEXT3264(CONCAT824(uStack_5fa8,
                                                              CONCAT816(uStack_5fb0,
                                                                        CONCAT88(uStack_5fb8,
                                                                                 local_5fc0))));
                                _local_6120 = local_5f60;
                                local_6040 = local_6180;
                                _local_5fa0 = local_5ec0;
                                auVar253 = local_6000;
                              }
                              else {
                                auVar135 = vandps_avx(_local_61a0,auVar135);
                                fVar162 = auVar201._28_4_;
                                auVar261._0_4_ =
                                     uVar92 ^ (uint)(fVar158 * auVar146._0_4_ +
                                                    auVar202._0_4_ * fVar194 +
                                                    auVar203._0_4_ * fVar219);
                                auVar261._4_4_ =
                                     uVar182 ^ (uint)(fVar250 * auVar146._4_4_ +
                                                     auVar202._4_4_ * fVar161 +
                                                     auVar203._4_4_ * fVar249);
                                auVar261._8_4_ =
                                     uVar184 ^ (uint)(fVar24 * auVar146._8_4_ +
                                                     auVar202._8_4_ * fVar14 +
                                                     auVar203._8_4_ * fVar18);
                                auVar261._12_4_ =
                                     uVar186 ^ (uint)(fVar15 * auVar146._12_4_ +
                                                     auVar202._12_4_ * fVar35 +
                                                     auVar203._12_4_ * fVar36);
                                auVar261._16_4_ =
                                     uVar188 ^ (uint)(fVar21 * auVar146._16_4_ +
                                                     auVar202._16_4_ * fVar19 +
                                                     auVar203._16_4_ * fVar20);
                                auVar261._20_4_ =
                                     uVar190 ^ (uint)(fVar27 * auVar146._20_4_ +
                                                     auVar202._20_4_ * fVar25 +
                                                     auVar203._20_4_ * fVar26);
                                auVar261._24_4_ =
                                     uVar192 ^ (uint)(fVar227 * auVar146._24_4_ +
                                                     auVar202._24_4_ * fVar31 +
                                                     auVar203._24_4_ * fVar218);
                                auVar261._28_4_ =
                                     uVar193 ^ (uint)(fVar162 + auVar118._28_4_ + fVar162);
                                auVar202 = vcmpps_avx(auVar261,_DAT_01faff00,5);
                                auVar201 = auVar135 & auVar202;
                                if ((((((((auVar201 >> 0x1f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar201 >> 0x3f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar201 >> 0x5f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) || SUB321(auVar201 >> 0x7f,0) != '\0'
                                       ) || (auVar201 & (undefined1  [32])0x100000000) !=
                                            (undefined1  [32])0x0) ||
                                     SUB321(auVar201 >> 0xbf,0) != '\0') ||
                                    (auVar201 & (undefined1  [32])0x100000000) !=
                                    (undefined1  [32])0x0) || auVar201[0x1f] < '\0') {
                                  auVar245._8_4_ = 0x7fffffff;
                                  auVar245._0_8_ = 0x7fffffff7fffffff;
                                  auVar245._12_4_ = 0x7fffffff;
                                  auVar245._16_4_ = 0x7fffffff;
                                  auVar245._20_4_ = 0x7fffffff;
                                  auVar245._24_4_ = 0x7fffffff;
                                  auVar245._28_4_ = 0x7fffffff;
                                  auVar201 = vandps_avx(auVar134,auVar245);
                                  auVar135 = vandps_avx(auVar202,auVar135);
                                  auVar202 = vsubps_avx(auVar201,auVar253);
                                  auVar202 = vcmpps_avx(auVar202,auVar261,5);
                                  auVar32 = auVar135 & auVar202;
                                  if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (auVar32 >> 0x3f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar32 >> 0x5f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         SUB321(auVar32 >> 0x7f,0) != '\0') ||
                                        (auVar32 & (undefined1  [32])0x100000000) !=
                                        (undefined1  [32])0x0) || SUB321(auVar32 >> 0xbf,0) != '\0')
                                      || (auVar32 & (undefined1  [32])0x100000000) !=
                                         (undefined1  [32])0x0) || auVar32[0x1f] < '\0') {
                                    auVar135 = vandps_avx(auVar202,auVar135);
                                    fVar162 = fVar162 + auVar33._28_4_ + auVar202._28_4_;
                                    local_6120._0_4_ =
                                         uVar92 ^ (uint)((float)local_5fa0._0_4_ * fVar160 +
                                                        fVar207 * fVar159 +
                                                        fVar230 * local_6040._0_4_);
                                    local_6120._4_4_ =
                                         uVar182 ^ (uint)((float)local_5fa0._4_4_ * fVar13 +
                                                         fVar212 * fVar138 +
                                                         fVar237 * local_6040._4_4_);
                                    fStack_6118 = (float)(uVar184 ^
                                                         (uint)((float)uStack_5f98 * fVar34 +
                                                               fVar213 * fVar30 +
                                                               fVar238 * local_6040._8_4_));
                                    fStack_6114 = (float)(uVar186 ^
                                                         (uint)(uStack_5f98._4_4_ * fVar17 +
                                                               fVar214 * fVar16 +
                                                               fVar239 * local_6040._12_4_));
                                    fStack_6110 = (float)(uVar188 ^
                                                         (uint)((float)uStack_5f90 * fVar23 +
                                                               fVar215 * fVar22 +
                                                               fVar240 * local_6040._16_4_));
                                    fStack_610c = (float)(uVar190 ^
                                                         (uint)(uStack_5f90._4_4_ * fVar29 +
                                                               fVar216 * fVar28 +
                                                               fVar241 * local_6040._20_4_));
                                    fStack_6108 = (float)(uVar192 ^
                                                         (uint)((float)uStack_5f88 * fVar229 +
                                                               fVar217 * fVar228 +
                                                               fVar242 * local_6040._24_4_));
                                    register0x0000131c = uVar193 ^ (uint)fVar162;
                                    auVar211 = ZEXT3264(_local_6120);
                                    auVar73._4_4_ = auVar201._4_4_ * *(float *)(ray + 100);
                                    auVar73._0_4_ = auVar201._0_4_ * *(float *)(ray + 0x60);
                                    auVar73._8_4_ = auVar201._8_4_ * *(float *)(ray + 0x68);
                                    auVar73._12_4_ = auVar201._12_4_ * *(float *)(ray + 0x6c);
                                    auVar73._16_4_ = auVar201._16_4_ * *(float *)(ray + 0x70);
                                    auVar73._20_4_ = auVar201._20_4_ * *(float *)(ray + 0x74);
                                    auVar73._24_4_ = auVar201._24_4_ * *(float *)(ray + 0x78);
                                    auVar73._28_4_ = fVar162;
                                    auVar74._4_4_ = auVar201._4_4_ * *(float *)(ray + 0x104);
                                    auVar74._0_4_ = auVar201._0_4_ * *(float *)(ray + 0x100);
                                    auVar74._8_4_ = auVar201._8_4_ * *(float *)(ray + 0x108);
                                    auVar74._12_4_ = auVar201._12_4_ * *(float *)(ray + 0x10c);
                                    auVar74._16_4_ = auVar201._16_4_ * *(float *)(ray + 0x110);
                                    auVar74._20_4_ = auVar201._20_4_ * *(float *)(ray + 0x114);
                                    auVar74._24_4_ = auVar201._24_4_ * *(float *)(ray + 0x118);
                                    auVar74._28_4_ = uVar193;
                                    auVar202 = vcmpps_avx(auVar73,_local_6120,1);
                                    auVar32 = vcmpps_avx(_local_6120,auVar74,2);
                                    auVar117 = auVar32._0_16_;
                                    auVar202 = vandps_avx(auVar32,auVar202);
                                    auVar32 = auVar135 & auVar202;
                                    if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0 ||
                                             (auVar32 >> 0x3f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar32 >> 0x5f & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           SUB321(auVar32 >> 0x7f,0) != '\0') ||
                                          (auVar32 & (undefined1  [32])0x100000000) !=
                                          (undefined1  [32])0x0) ||
                                         SUB321(auVar32 >> 0xbf,0) != '\0') ||
                                        (auVar32 & (undefined1  [32])0x100000000) !=
                                        (undefined1  [32])0x0) || auVar32[0x1f] < '\0') {
                                      auVar135 = vandps_avx(auVar202,auVar135);
                                      auVar202 = vcmpps_avx(auVar134,_DAT_01faff00,4);
                                      auVar32 = auVar135 & auVar202;
                                      if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0 ||
                                               (auVar32 >> 0x3f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar32 >> 0x5f & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             SUB321(auVar32 >> 0x7f,0) != '\0') ||
                                            (auVar32 & (undefined1  [32])0x100000000) !=
                                            (undefined1  [32])0x0) ||
                                           SUB321(auVar32 >> 0xbf,0) != '\0') ||
                                          (auVar32 & (undefined1  [32])0x100000000) !=
                                          (undefined1  [32])0x0) || auVar32[0x1f] < '\0') {
                                        auVar135 = vandps_avx(auVar202,auVar135);
                                        auVar157 = ZEXT3264(auVar135);
                                        local_6160 = auVar261;
                                        local_6100._0_4_ = fVar207;
                                        local_6100._4_4_ = fVar212;
                                        fStack_60f8 = fVar213;
                                        fStack_60f4 = fVar214;
                                        fStack_60f0 = fVar215;
                                        fStack_60ec = fVar216;
                                        fStack_60e8 = fVar217;
                                        fStack_60e4 = auVar118._28_4_;
                                        local_6020 = auVar201;
                                        goto LAB_01549ed0;
                                      }
                                    }
                                    auVar157 = ZEXT3264(CONCAT824(uStack_5fa8,
                                                                  CONCAT816(uStack_5fb0,
                                                                            CONCAT88(uStack_5fb8,
                                                                                     local_5fc0))));
                                    _local_6120 = local_5f60;
                                    local_6040 = local_6180;
                                    _local_5fa0 = local_5ec0;
                                    auVar253 = local_6000;
                                    goto LAB_01549ed0;
                                  }
                                }
                                auVar211 = ZEXT3264(auVar202);
                                auVar157 = ZEXT3264(CONCAT824(uStack_5fa8,
                                                              CONCAT816(uStack_5fb0,
                                                                        CONCAT88(uStack_5fb8,
                                                                                 local_5fc0))));
                                _local_6120 = local_5f60;
                                local_6040 = local_6180;
                                _local_5fa0 = local_5ec0;
                                auVar253 = local_6000;
                              }
LAB_01549ed0:
                              auVar180 = ZEXT3264(_local_61a0);
                              auVar135 = auVar157._0_32_;
                              local_5ee0._4_4_ = local_6100._4_4_;
                              local_5ee0._0_4_ = local_6100._0_4_;
                              fStack_5ed8 = fStack_60f8;
                              fStack_5ed4 = fStack_60f4;
                              fStack_5ed0 = fStack_60f0;
                              fStack_5ecc = fStack_60ec;
                              fStack_5ec8 = fStack_60e8;
                              fStack_5ec4 = fStack_60e4;
                              if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0 ||
                                       (auVar135 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar135 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar135 >> 0x7f,0) != '\0')
                                    || (auVar157 & (undefined1  [64])0x100000000) !=
                                       (undefined1  [64])0x0) || SUB321(auVar135 >> 0xbf,0) != '\0')
                                  || (auVar157 & (undefined1  [64])0x100000000) !=
                                     (undefined1  [64])0x0) || auVar157[0x1f] < '\0') {
                                auVar202 = vsubps_avx(local_6020,auVar253);
                                auVar118 = vsubps_avx(local_6020,local_6160);
                                fVar194 = (float)(int)(*(ushort *)(lVar12 + 8 + lVar101) - 1);
                                auVar117 = vrcpss_avx(ZEXT416((uint)fVar194),ZEXT416((uint)fVar194))
                                ;
                                fVar219 = (float)(int)(*(ushort *)(lVar12 + 10 + lVar101) - 1);
                                auVar108 = ZEXT416((uint)(float)(int)(((uint)uVar100 & 1) + uVar93))
                                ;
                                auVar108 = vshufps_avx(auVar108,auVar108,0);
                                fVar158 = local_6020._0_4_;
                                fVar159 = local_6020._4_4_;
                                fVar160 = local_6020._8_4_;
                                fVar161 = local_6020._12_4_;
                                fVar249 = local_6020._16_4_;
                                fVar250 = local_6020._20_4_;
                                fVar138 = local_6020._24_4_;
                                auVar117 = ZEXT416((uint)(auVar117._0_4_ *
                                                         (2.0 - auVar117._0_4_ * fVar194)));
                                auVar117 = vshufps_avx(auVar117,auVar117,0);
                                auVar67._4_4_ =
                                     (auVar202._4_4_ + fVar159 * auVar108._4_4_) * auVar117._4_4_;
                                auVar67._0_4_ =
                                     (auVar202._0_4_ + fVar158 * auVar108._0_4_) * auVar117._0_4_;
                                auVar67._8_4_ =
                                     (auVar202._8_4_ + fVar160 * auVar108._8_4_) * auVar117._8_4_;
                                auVar67._12_4_ =
                                     (auVar202._12_4_ + fVar161 * auVar108._12_4_) * auVar117._12_4_
                                ;
                                auVar67._16_4_ =
                                     (auVar202._16_4_ + fVar249 * auVar108._0_4_) * auVar117._0_4_;
                                auVar67._20_4_ =
                                     (auVar202._20_4_ + fVar250 * auVar108._4_4_) * auVar117._4_4_;
                                auVar67._24_4_ =
                                     (auVar202._24_4_ + fVar138 * auVar108._8_4_) * auVar117._8_4_;
                                auVar67._28_4_ = auVar117._12_4_;
                                auVar117 = vrcpss_avx(ZEXT416((uint)fVar219),ZEXT416((uint)fVar219))
                                ;
                                auVar211 = ZEXT1664(auVar117);
                                auVar253 = vblendvps_avx(auVar202,auVar67,auVar135);
                                auVar108 = ZEXT416((uint)(float)(int)(((uint)(uVar100 >> 1) &
                                                                      0x7fffffff) + (int)fVar94));
                                auVar108 = vshufps_avx(auVar108,auVar108,0);
                                auVar117 = ZEXT416((uint)(auVar117._0_4_ *
                                                         (2.0 - auVar117._0_4_ * fVar219)));
                                auVar117 = vshufps_avx(auVar117,auVar117,0);
                                auVar68._4_4_ =
                                     (auVar118._4_4_ + fVar159 * auVar108._4_4_) * auVar117._4_4_;
                                auVar68._0_4_ =
                                     (auVar118._0_4_ + fVar158 * auVar108._0_4_) * auVar117._0_4_;
                                auVar68._8_4_ =
                                     (auVar118._8_4_ + fVar160 * auVar108._8_4_) * auVar117._8_4_;
                                auVar68._12_4_ =
                                     (auVar118._12_4_ + fVar161 * auVar108._12_4_) * auVar117._12_4_
                                ;
                                auVar68._16_4_ =
                                     (auVar118._16_4_ + fVar249 * auVar108._0_4_) * auVar117._0_4_;
                                auVar68._20_4_ =
                                     (auVar118._20_4_ + fVar250 * auVar108._4_4_) * auVar117._4_4_;
                                auVar68._24_4_ =
                                     (auVar118._24_4_ + fVar138 * auVar108._8_4_) * auVar117._8_4_;
                                auVar68._28_4_ = auVar117._12_4_;
                                local_6160 = vblendvps_avx(auVar118,auVar68,auVar135);
                                uVar182 = *(uint *)((long)&local_5e40 + uVar100 * 4);
                                pGVar8 = (context->scene->geometries).items[uVar182].ptr;
                                uVar92 = pGVar8->mask;
                                auVar152._4_4_ = uVar92;
                                auVar152._0_4_ = uVar92;
                                auVar152._8_4_ = uVar92;
                                auVar152._12_4_ = uVar92;
                                auVar152._16_4_ = uVar92;
                                auVar152._20_4_ = uVar92;
                                auVar152._24_4_ = uVar92;
                                auVar152._28_4_ = uVar92;
                                auVar202 = vandps_avx(auVar152,*(undefined1 (*) [32])(ray + 0x120));
                                auVar77._12_4_ = 0;
                                auVar77._0_12_ = ZEXT412(0);
                                auVar108 = vpcmpeqd_avx(auVar202._16_16_,auVar77 << 0x20);
                                auVar145 = vpcmpeqd_avx(auVar202._0_16_,auVar77 << 0x20);
                                auVar117 = auVar157._0_16_;
                                auVar174._16_16_ = auVar108;
                                auVar174._0_16_ = auVar117;
                                auVar202 = vblendps_avx(ZEXT1632(auVar145),auVar174,0xf0);
                                auVar118 = auVar135 & ~auVar202;
                                if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar118 >> 0x3f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar118 >> 0x5f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) || SUB321(auVar118 >> 0x7f,0) != '\0'
                                       ) || (auVar118 & (undefined1  [32])0x100000000) !=
                                            (undefined1  [32])0x0) ||
                                     SUB321(auVar118 >> 0xbf,0) != '\0') ||
                                    (auVar118 & (undefined1  [32])0x100000000) !=
                                    (undefined1  [32])0x0) || auVar118[0x1f] < '\0') {
                                  local_6130._0_8_ = uVar100;
                                  auVar136 = vandnps_avx(auVar202,auVar135);
                                  auVar145 = auVar136._0_16_;
                                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                     (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                    local_6080 = fVar94;
                                    local_6060 = CONCAT44(local_6060._4_4_,uVar93);
                                    auVar135 = vrcpps_avx(local_6020);
                                    fVar94 = auVar135._0_4_;
                                    fVar194 = auVar135._4_4_;
                                    auVar71._4_4_ = fVar159 * fVar194;
                                    auVar71._0_4_ = fVar158 * fVar94;
                                    fVar219 = auVar135._8_4_;
                                    auVar71._8_4_ = fVar160 * fVar219;
                                    fVar158 = auVar135._12_4_;
                                    auVar71._12_4_ = fVar161 * fVar158;
                                    fVar159 = auVar135._16_4_;
                                    auVar71._16_4_ = fVar249 * fVar159;
                                    fVar160 = auVar135._20_4_;
                                    auVar71._20_4_ = fVar250 * fVar160;
                                    fVar161 = auVar135._24_4_;
                                    auVar71._24_4_ = fVar138 * fVar161;
                                    auVar71._28_4_ = auVar108._12_4_;
                                    auVar206._8_4_ = 0x3f800000;
                                    auVar206._0_8_ = 0x3f8000003f800000;
                                    auVar206._12_4_ = 0x3f800000;
                                    auVar206._16_4_ = 0x3f800000;
                                    auVar206._20_4_ = 0x3f800000;
                                    auVar206._24_4_ = 0x3f800000;
                                    auVar206._28_4_ = 0x3f800000;
                                    auVar202 = vsubps_avx(auVar206,auVar71);
                                    fVar94 = fVar94 + fVar94 * auVar202._0_4_;
                                    fVar194 = fVar194 + fVar194 * auVar202._4_4_;
                                    fVar219 = fVar219 + fVar219 * auVar202._8_4_;
                                    fVar158 = fVar158 + fVar158 * auVar202._12_4_;
                                    fVar159 = fVar159 + fVar159 * auVar202._16_4_;
                                    fVar160 = fVar160 + fVar160 * auVar202._20_4_;
                                    fVar161 = fVar161 + fVar161 * auVar202._24_4_;
                                    pRVar11 = context->user;
                                    local_5ab0 = vpshufd_avx(ZEXT416(uVar182),0);
                                    local_5ad0 = vpshufd_avx(ZEXT416(*(uint *)((long)&local_5e60 +
                                                                              uVar100 * 4)),0);
                                    _local_5b80 = _local_5fa0;
                                    local_5b60._4_4_ = local_6100._4_4_;
                                    local_5b60._0_4_ = local_6100._0_4_;
                                    fStack_5b58 = fStack_60f8;
                                    fStack_5b54 = fStack_60f4;
                                    fStack_5b50 = fStack_60f0;
                                    fStack_5b4c = fStack_60ec;
                                    fStack_5b48 = fStack_60e8;
                                    fStack_5b44 = fStack_60e4;
                                    local_5b40 = local_6040._0_8_;
                                    uStack_5b38 = local_6040._8_8_;
                                    uStack_5b30 = local_6040._16_8_;
                                    uStack_5b28 = local_6040._24_8_;
                                    local_5b20 = auVar253._0_4_ * fVar94;
                                    fStack_5b1c = auVar253._4_4_ * fVar194;
                                    fStack_5b18 = auVar253._8_4_ * fVar219;
                                    fStack_5b14 = auVar253._12_4_ * fVar158;
                                    fStack_5b10 = auVar253._16_4_ * fVar159;
                                    fStack_5b0c = auVar253._20_4_ * fVar160;
                                    fStack_5b08 = auVar253._24_4_ * fVar161;
                                    fStack_5b04 = auVar202._28_4_;
                                    local_5b00 = local_6160._0_4_ * fVar94;
                                    fStack_5afc = local_6160._4_4_ * fVar194;
                                    fStack_5af8 = local_6160._8_4_ * fVar219;
                                    fStack_5af4 = local_6160._12_4_ * fVar158;
                                    fStack_5af0 = local_6160._16_4_ * fVar159;
                                    fStack_5aec = local_6160._20_4_ * fVar160;
                                    fStack_5ae8 = local_6160._24_4_ * fVar161;
                                    uStack_5ae4 = 0x3f800000;
                                    local_5ae0 = local_5ad0;
                                    local_5ac0 = local_5ab0;
                                    local_5fd0[1] = local_5f80;
                                    *local_5fd0 = local_5f80;
                                    local_5aa0 = pRVar11->instID[0];
                                    auVar72._4_4_ = fVar194 * (float)local_6120._4_4_;
                                    auVar72._0_4_ = fVar94 * (float)local_6120._0_4_;
                                    auVar72._8_4_ = fVar219 * fStack_6118;
                                    auVar72._12_4_ = fVar158 * fStack_6114;
                                    auVar72._16_4_ = fVar159 * fStack_6110;
                                    auVar72._20_4_ = fVar160 * fStack_610c;
                                    auVar72._24_4_ = fVar161 * fStack_6108;
                                    auVar72._28_4_ = auVar135._28_4_ + auVar202._28_4_;
                                    uStack_5a9c = local_5aa0;
                                    uStack_5a98 = local_5aa0;
                                    uStack_5a94 = local_5aa0;
                                    uStack_5a90 = local_5aa0;
                                    uStack_5a8c = local_5aa0;
                                    uStack_5a88 = local_5aa0;
                                    uStack_5a84 = local_5aa0;
                                    local_5a80 = pRVar11->instPrimID[0];
                                    uStack_5a7c = local_5a80;
                                    uStack_5a78 = local_5a80;
                                    uStack_5a74 = local_5a80;
                                    uStack_5a70 = local_5a80;
                                    uStack_5a6c = local_5a80;
                                    uStack_5a68 = local_5a80;
                                    uStack_5a64 = local_5a80;
                                    local_6180 = *(undefined1 (*) [32])(ray + 0x100);
                                    auVar135 = vblendvps_avx(local_6180,auVar72,auVar136);
                                    *(undefined1 (*) [32])(ray + 0x100) = auVar135;
                                    _local_60e0 = auVar136;
                                    local_60c0 = (undefined1  [8])local_60e0;
                                    uStack_60b8 = pGVar8->userPtr;
                                    uStack_60b0 = context->user;
                                    uStack_60a8 = ray;
                                    local_60a0 = (RTCHitN *)local_5b80;
                                    local_6098 = 8;
                                    _local_6100 = auVar253;
                                    if (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0) {
                                      auVar108 = auVar136._16_16_;
                                    }
                                    else {
                                      (*pGVar8->occlusionFilterN)
                                                ((RTCFilterFunctionNArguments *)local_60c0);
                                      auVar108 = _auStack_60d0;
                                      auVar145 = _local_60e0;
                                    }
                                    auVar211 = ZEXT3264(local_5f80);
                                    auVar117 = vpcmpeqd_avx(auVar145,ZEXT816(0) << 0x40);
                                    auVar109 = vpcmpeqd_avx(auVar108,ZEXT816(0) << 0x40);
                                    auVar176._16_16_ = auVar109;
                                    auVar176._0_16_ = auVar117;
                                    auVar135 = local_5f80 & ~auVar176;
                                    uVar93 = (uint)(float)local_6060;
                                    auVar253 = _local_6100;
                                    if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0 &&
                                             (auVar135 >> 0x3f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar135 >> 0x5f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           SUB321(auVar135 >> 0x7f,0) == '\0') &&
                                          (auVar135 & (undefined1  [32])0x100000000) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar135 >> 0xbf,0) == '\0') &&
                                        (auVar135 & (undefined1  [32])0x100000000) ==
                                        (undefined1  [32])0x0) && -1 < auVar135[0x1f]) {
                                      auVar136._0_4_ = auVar117._0_4_ ^ local_5f80._0_4_;
                                      auVar136._4_4_ = auVar117._4_4_ ^ local_5f80._4_4_;
                                      auVar136._8_4_ = auVar117._8_4_ ^ local_5f80._8_4_;
                                      auVar136._12_4_ = auVar117._12_4_ ^ local_5f80._12_4_;
                                      auVar136._16_4_ = auVar109._0_4_ ^ local_5f80._16_4_;
                                      auVar136._20_4_ = auVar109._4_4_ ^ local_5f80._20_4_;
                                      auVar136._24_4_ = auVar109._8_4_ ^ local_5f80._24_4_;
                                      auVar136._28_4_ = auVar109._12_4_ ^ local_5f80._28_4_;
                                    }
                                    else {
                                      p_Var10 = context->args->filter;
                                      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                                         (((context->args->flags &
                                           RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                          (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                                        (*p_Var10)((RTCFilterFunctionNArguments *)local_60c0);
                                        auVar211 = ZEXT3264(local_5f80);
                                        auVar145 = _local_60e0;
                                        auVar108 = _auStack_60d0;
                                        uVar93 = (uint)(float)local_6060;
                                        auVar253 = _local_6100;
                                      }
                                      auVar117 = vpcmpeqd_avx(auVar145,ZEXT816(0) << 0x40);
                                      auVar108 = vpcmpeqd_avx(auVar108,ZEXT816(0) << 0x40);
                                      auVar154._16_16_ = auVar108;
                                      auVar154._0_16_ = auVar117;
                                      auVar136._0_4_ = auVar117._0_4_ ^ auVar211._0_4_;
                                      auVar136._4_4_ = auVar117._4_4_ ^ auVar211._4_4_;
                                      auVar136._8_4_ = auVar117._8_4_ ^ auVar211._8_4_;
                                      auVar136._12_4_ = auVar117._12_4_ ^ auVar211._12_4_;
                                      auVar136._16_4_ = auVar108._0_4_ ^ auVar211._16_4_;
                                      auVar136._20_4_ = auVar108._4_4_ ^ auVar211._20_4_;
                                      auVar136._24_4_ = auVar108._8_4_ ^ auVar211._24_4_;
                                      auVar136._28_4_ = auVar108._12_4_ ^ auVar211._28_4_;
                                      auVar117._8_4_ = 0xff800000;
                                      auVar117._0_8_ = 0xff800000ff800000;
                                      auVar117._12_4_ = 0xff800000;
                                      auVar177._16_4_ = 0xff800000;
                                      auVar177._0_16_ = auVar117;
                                      auVar177._20_4_ = 0xff800000;
                                      auVar177._24_4_ = 0xff800000;
                                      auVar177._28_4_ = 0xff800000;
                                      auVar135 = vblendvps_avx(auVar177,*(undefined1 (*) [32])
                                                                         (uStack_60a8 + 0x100),
                                                               auVar154);
                                      *(undefined1 (*) [32])(uStack_60a8 + 0x100) = auVar135;
                                    }
                                    auVar135 = vblendvps_avx(local_6180,
                                                             *(undefined1 (*) [32])local_5fd8,
                                                             auVar136);
                                    *(undefined1 (*) [32])local_5fd8 = auVar135;
                                    fVar94 = local_6080;
                                  }
                                  auVar135 = vandnps_avx(auVar136,_local_61a0);
                                  auVar180 = ZEXT3264(auVar135);
                                  uVar100 = local_6130._0_8_;
                                }
                              }
                              _local_6100 = auVar253;
                              auVar135 = auVar180._0_32_;
                              unaff_R14 = uVar100;
                              if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar135 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar135 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar135 >> 0x7f,0) == '\0')
                                    && (auVar180 & (undefined1  [64])0x100000000) ==
                                       (undefined1  [64])0x0) && SUB321(auVar135 >> 0xbf,0) == '\0')
                                  && (auVar180 & (undefined1  [64])0x100000000) ==
                                     (undefined1  [64])0x0) && -1 < auVar180[0x1f]) break;
                              unaff_R14 = uVar100 + 1;
                              pfVar98 = pfVar98 + 0x10;
                              bVar107 = uVar100 < 3;
                              uVar100 = unaff_R14;
                            } while (bVar107);
                            auVar202 = local_5ea0 & auVar135;
                            bVar107 = (((((((auVar202 >> 0x1f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0 &&
                                           (auVar202 >> 0x3f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar202 >> 0x5f & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar202 >> 0x7f,0) == '\0') &&
                                        (auVar202 & (undefined1  [32])0x100000000) ==
                                        (undefined1  [32])0x0) && SUB321(auVar202 >> 0xbf,0) == '\0'
                                       ) && (auVar202 & (undefined1  [32])0x100000000) ==
                                            (undefined1  [32])0x0) && -1 < auVar202[0x1f];
                            local_5ea0 = vandps_avx(auVar135,local_5ea0);
                            uVar95 = local_5ee8;
                            lVar96 = local_5ef0;
                            uVar100 = local_5fc8;
                          }
                        } while ((!bVar107) && (uVar95 = uVar95 & uVar95 - 1, uVar95 != 0));
                      }
                      lVar96 = local_5ef8 + 1;
                    } while (lVar96 != local_5f00);
                    auVar155._0_4_ = local_5ea0._0_4_ ^ local_5f80._0_4_;
                    auVar155._4_4_ = local_5ea0._4_4_ ^ local_5f80._4_4_;
                    auVar155._8_4_ = local_5ea0._8_4_ ^ local_5f80._8_4_;
                    auVar155._12_4_ = local_5ea0._12_4_ ^ local_5f80._12_4_;
                    auVar155._16_4_ = local_5ea0._16_4_ ^ local_5f80._16_4_;
                    auVar155._20_4_ = local_5ea0._20_4_ ^ local_5f80._20_4_;
                    auVar155._24_4_ = local_5ea0._24_4_ ^ local_5f80._24_4_;
                    auVar155._28_4_ = local_5ea0._28_4_ ^ local_5f80._28_4_;
                  }
                  _local_5f40 = vorps_avx(_local_5f40,auVar155);
                  auVar117 = vpcmpeqd_avx(auVar117,auVar117);
                  auVar108 = vpcmpgtd_avx(local_5f40._16_16_,auVar117);
                  auVar117 = vpcmpgtd_avx(local_5f40._0_16_,auVar117);
                  auVar117 = vpor_avx(auVar117,auVar108);
                  if ((((auVar117 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar117 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar117 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < auVar117[0xf]) goto LAB_0154ad0b;
                  auVar179._8_4_ = 0xff800000;
                  auVar179._0_8_ = 0xff800000ff800000;
                  auVar179._12_4_ = 0xff800000;
                  auVar179._16_4_ = 0xff800000;
                  auVar179._20_4_ = 0xff800000;
                  auVar179._24_4_ = 0xff800000;
                  auVar179._28_4_ = 0xff800000;
                  auVar180 = ZEXT3264(auVar179);
                  local_5ba0 = vblendvps_avx(local_5ba0,auVar179,_local_5f40);
                }
                goto LAB_01549052;
              }
              uVar99 = 8;
              lVar96 = 0;
              auVar119._8_4_ = 0x7f800000;
              auVar119._0_8_ = 0x7f8000007f800000;
              auVar119._12_4_ = 0x7f800000;
              auVar119._16_4_ = 0x7f800000;
              auVar119._20_4_ = 0x7f800000;
              auVar119._24_4_ = 0x7f800000;
              auVar119._28_4_ = 0x7f800000;
              do {
                auVar135 = auVar119;
                uVar95 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar96 * 8);
                if (uVar95 == 8) {
                  auVar157 = ZEXT3264(auVar135);
                  break;
                }
                uVar105 = *(undefined4 *)(root.ptr + 0x40 + lVar96 * 4);
                auVar147._4_4_ = uVar105;
                auVar147._0_4_ = uVar105;
                auVar147._8_4_ = uVar105;
                auVar147._12_4_ = uVar105;
                auVar147._16_4_ = uVar105;
                auVar147._20_4_ = uVar105;
                auVar147._24_4_ = uVar105;
                auVar147._28_4_ = uVar105;
                auVar78._8_8_ = local_5d40._8_8_;
                auVar78._0_8_ = local_5d40._0_8_;
                auVar78._16_8_ = local_5d40._16_8_;
                auVar78._24_8_ = local_5d40._24_8_;
                auVar80._8_8_ = local_5d40._40_8_;
                auVar80._0_8_ = local_5d40._32_8_;
                auVar80._16_8_ = local_5d40._48_8_;
                auVar80._24_8_ = local_5d40._56_8_;
                auVar82._8_8_ = local_5d40._72_8_;
                auVar82._0_8_ = local_5d40._64_8_;
                auVar82._16_8_ = local_5d40._80_8_;
                auVar82._24_8_ = local_5d40._88_8_;
                auVar202 = vsubps_avx(auVar147,auVar78);
                auVar139._0_4_ = (float)local_5c80._0_4_ * auVar202._0_4_;
                auVar139._4_4_ = (float)local_5c80._4_4_ * auVar202._4_4_;
                auVar139._8_4_ = fStack_5c78 * auVar202._8_4_;
                auVar139._12_4_ = fStack_5c74 * auVar202._12_4_;
                auVar38._16_4_ = fStack_5c70 * auVar202._16_4_;
                auVar38._0_16_ = auVar139;
                auVar38._20_4_ = fStack_5c6c * auVar202._20_4_;
                auVar38._24_4_ = fStack_5c68 * auVar202._24_4_;
                auVar38._28_4_ = auVar202._28_4_;
                uVar105 = *(undefined4 *)(root.ptr + 0x80 + lVar96 * 4);
                auVar167._4_4_ = uVar105;
                auVar167._0_4_ = uVar105;
                auVar167._8_4_ = uVar105;
                auVar167._12_4_ = uVar105;
                auVar167._16_4_ = uVar105;
                auVar167._20_4_ = uVar105;
                auVar167._24_4_ = uVar105;
                auVar167._28_4_ = uVar105;
                auVar202 = vsubps_avx(auVar167,auVar80);
                auVar165._0_4_ = (float)local_5c60._0_4_ * auVar202._0_4_;
                auVar165._4_4_ = (float)local_5c60._4_4_ * auVar202._4_4_;
                auVar165._8_4_ = fStack_5c58 * auVar202._8_4_;
                auVar165._12_4_ = fStack_5c54 * auVar202._12_4_;
                auVar39._16_4_ = fStack_5c50 * auVar202._16_4_;
                auVar39._0_16_ = auVar165;
                auVar39._20_4_ = fStack_5c4c * auVar202._20_4_;
                auVar39._24_4_ = fStack_5c48 * auVar202._24_4_;
                auVar39._28_4_ = auVar202._28_4_;
                uVar105 = *(undefined4 *)(root.ptr + 0xc0 + lVar96 * 4);
                auVar204._4_4_ = uVar105;
                auVar204._0_4_ = uVar105;
                auVar204._8_4_ = uVar105;
                auVar204._12_4_ = uVar105;
                auVar204._16_4_ = uVar105;
                auVar204._20_4_ = uVar105;
                auVar204._24_4_ = uVar105;
                auVar204._28_4_ = uVar105;
                auVar202 = vsubps_avx(auVar204,auVar82);
                auVar195._0_4_ = (float)local_5c40._0_4_ * auVar202._0_4_;
                auVar195._4_4_ = (float)local_5c40._4_4_ * auVar202._4_4_;
                auVar195._8_4_ = fStack_5c38 * auVar202._8_4_;
                auVar195._12_4_ = fStack_5c34 * auVar202._12_4_;
                auVar40._16_4_ = fStack_5c30 * auVar202._16_4_;
                auVar40._0_16_ = auVar195;
                auVar40._20_4_ = fStack_5c2c * auVar202._20_4_;
                auVar40._24_4_ = fStack_5c28 * auVar202._24_4_;
                auVar40._28_4_ = auVar202._28_4_;
                uVar105 = *(undefined4 *)(root.ptr + 0x60 + lVar96 * 4);
                auVar251._4_4_ = uVar105;
                auVar251._0_4_ = uVar105;
                auVar251._8_4_ = uVar105;
                auVar251._12_4_ = uVar105;
                auVar251._16_4_ = uVar105;
                auVar251._20_4_ = uVar105;
                auVar251._24_4_ = uVar105;
                auVar251._28_4_ = uVar105;
                auVar202 = vsubps_avx(auVar251,auVar78);
                auVar208._0_4_ = (float)local_5c80._0_4_ * auVar202._0_4_;
                auVar208._4_4_ = (float)local_5c80._4_4_ * auVar202._4_4_;
                auVar208._8_4_ = fStack_5c78 * auVar202._8_4_;
                auVar208._12_4_ = fStack_5c74 * auVar202._12_4_;
                auVar41._16_4_ = fStack_5c70 * auVar202._16_4_;
                auVar41._0_16_ = auVar208;
                auVar41._20_4_ = fStack_5c6c * auVar202._20_4_;
                auVar41._24_4_ = fStack_5c68 * auVar202._24_4_;
                auVar41._28_4_ = auVar202._28_4_;
                uVar105 = *(undefined4 *)(root.ptr + 0xa0 + lVar96 * 4);
                auVar243._4_4_ = uVar105;
                auVar243._0_4_ = uVar105;
                auVar243._8_4_ = uVar105;
                auVar243._12_4_ = uVar105;
                auVar243._16_4_ = uVar105;
                auVar243._20_4_ = uVar105;
                auVar243._24_4_ = uVar105;
                auVar243._28_4_ = uVar105;
                auVar202 = vsubps_avx(auVar243,auVar80);
                auVar220._0_4_ = (float)local_5c60._0_4_ * auVar202._0_4_;
                auVar220._4_4_ = (float)local_5c60._4_4_ * auVar202._4_4_;
                auVar220._8_4_ = fStack_5c58 * auVar202._8_4_;
                auVar220._12_4_ = fStack_5c54 * auVar202._12_4_;
                auVar42._16_4_ = fStack_5c50 * auVar202._16_4_;
                auVar42._0_16_ = auVar220;
                auVar42._20_4_ = fStack_5c4c * auVar202._20_4_;
                auVar42._24_4_ = fStack_5c48 * auVar202._24_4_;
                auVar42._28_4_ = auVar202._28_4_;
                uVar105 = *(undefined4 *)(root.ptr + 0xe0 + lVar96 * 4);
                auVar244._4_4_ = uVar105;
                auVar244._0_4_ = uVar105;
                auVar244._8_4_ = uVar105;
                auVar244._12_4_ = uVar105;
                auVar244._16_4_ = uVar105;
                auVar244._20_4_ = uVar105;
                auVar244._24_4_ = uVar105;
                auVar244._28_4_ = uVar105;
                auVar202 = vsubps_avx(auVar244,auVar82);
                auVar231._0_4_ = (float)local_5c40._0_4_ * auVar202._0_4_;
                auVar231._4_4_ = (float)local_5c40._4_4_ * auVar202._4_4_;
                auVar231._8_4_ = fStack_5c38 * auVar202._8_4_;
                auVar231._12_4_ = fStack_5c34 * auVar202._12_4_;
                auVar43._16_4_ = fStack_5c30 * auVar202._16_4_;
                auVar43._0_16_ = auVar231;
                auVar43._20_4_ = fStack_5c2c * auVar202._20_4_;
                auVar43._24_4_ = fStack_5c28 * auVar202._24_4_;
                auVar43._28_4_ = auVar202._28_4_;
                auVar117 = vpminsd_avx(auVar38._16_16_,auVar41._16_16_);
                auVar108 = vpminsd_avx(auVar139,auVar208);
                auVar145 = vpminsd_avx(auVar39._16_16_,auVar42._16_16_);
                auVar117 = vpmaxsd_avx(auVar117,auVar145);
                auVar145 = vpminsd_avx(auVar165,auVar220);
                auVar108 = vpmaxsd_avx(auVar108,auVar145);
                auVar145 = vpminsd_avx(auVar195,auVar231);
                auVar108 = vpmaxsd_avx(auVar108,auVar145);
                auVar145 = vpminsd_avx(auVar40._16_16_,auVar43._16_16_);
                auVar117 = vpmaxsd_avx(auVar117,auVar145);
                auVar145 = vpmaxsd_avx(auVar108,local_5bc0._0_16_);
                auVar109 = vpmaxsd_avx(auVar117,local_5bc0._16_16_);
                auVar140 = vpmaxsd_avx(auVar38._16_16_,auVar41._16_16_);
                auVar139 = vpmaxsd_avx(auVar139,auVar208);
                auVar208 = vpmaxsd_avx(auVar39._16_16_,auVar42._16_16_);
                auVar208 = vpminsd_avx(auVar140,auVar208);
                auVar211 = ZEXT1664(auVar208);
                auVar140 = vpmaxsd_avx(auVar165,auVar220);
                auVar139 = vpminsd_avx(auVar139,auVar140);
                auVar140 = vpmaxsd_avx(auVar195,auVar231);
                auVar139 = vpminsd_avx(auVar139,auVar140);
                auVar140 = vpmaxsd_avx(auVar40._16_16_,auVar43._16_16_);
                auVar140 = vpminsd_avx(auVar208,auVar140);
                auVar139 = vpminsd_avx(auVar139,local_5ba0._0_16_);
                auVar140 = vpminsd_avx(auVar140,local_5ba0._16_16_);
                auVar180 = ZEXT1664(auVar140);
                auVar120._16_16_ = auVar109;
                auVar120._0_16_ = auVar145;
                auVar148._16_16_ = auVar140;
                auVar148._0_16_ = auVar139;
                auVar202 = vcmpps_avx(auVar120,auVar148,2);
                if ((((((((auVar202 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar202 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar202 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar202 >> 0x7f,0) == '\0') &&
                      (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar202 >> 0xbf,0) == '\0') &&
                    (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar202[0x1f]) {
                  auVar157 = ZEXT3264(auVar135);
                  uVar95 = uVar99;
                }
                else {
                  auVar121._16_16_ = auVar117;
                  auVar121._0_16_ = auVar108;
                  auVar118 = vblendps_avx(auVar121,auVar121,0xf0);
                  auVar168._8_4_ = 0x7f800000;
                  auVar168._0_8_ = 0x7f8000007f800000;
                  auVar168._12_4_ = 0x7f800000;
                  auVar168._16_4_ = 0x7f800000;
                  auVar168._20_4_ = 0x7f800000;
                  auVar168._24_4_ = 0x7f800000;
                  auVar168._28_4_ = 0x7f800000;
                  auVar180 = ZEXT3264(auVar168);
                  auVar202 = vblendvps_avx(auVar168,auVar118,auVar202);
                  auVar157 = ZEXT3264(auVar202);
                  if (uVar99 != 8) {
                    *puVar104 = uVar99;
                    puVar104 = puVar104 + 1;
                    local_61a0._0_8_ = auVar135._0_8_;
                    local_61a0._8_8_ = auVar135._8_8_;
                    uStack_6190 = auVar135._16_8_;
                    uStack_6188 = auVar135._24_8_;
                    *(undefined8 *)*pauVar103 = local_61a0._0_8_;
                    *(undefined8 *)(*pauVar103 + 8) = local_61a0._8_8_;
                    *(undefined8 *)(*pauVar103 + 0x10) = uStack_6190;
                    *(undefined8 *)(*pauVar103 + 0x18) = uStack_6188;
                    pauVar103 = pauVar103 + 1;
                  }
                }
                uVar99 = uVar95;
                lVar96 = lVar96 + 1;
                auVar119 = auVar157._0_32_;
                _local_61a0 = auVar135;
              } while (lVar96 != 8);
              iVar91 = 4;
              if (uVar99 == 8) goto LAB_015492ca;
              auVar135 = vcmpps_avx(local_5ba0,auVar157._0_32_,6);
              uVar105 = vmovmskps_avx(auVar135);
              root.ptr = uVar99;
            } while ((byte)uVar100 < (byte)POPCOUNT(uVar105));
            *puVar104 = uVar99;
            puVar104 = puVar104 + 1;
            *pauVar103 = auVar157._0_32_;
            pauVar103 = pauVar103 + 1;
          }
          else {
            for (; unaff_R14 != 0; unaff_R14 = unaff_R14 & unaff_R14 - 1) {
              k = 0;
              if (unaff_R14 != 0) {
                for (; (unaff_R14 >> k & 1) == 0; k = k + 1) {
                }
              }
              local_61a0._0_8_ = k;
              auVar180 = ZEXT1664(auVar180._0_16_);
              auVar211 = ZEXT1664(auVar211._0_16_);
              bVar107 = occluded1(local_5f08,local_5f10,root,k,&local_61a1,ray,
                                  (TravRayK<8,_false> *)&local_5d40.field_0,context);
              auVar117 = auVar180._0_16_;
              if (bVar107) {
                *(undefined4 *)(local_5f40 + local_61a0._0_8_ * 4) = 0xffffffff;
              }
              uVar100 = local_5fc8;
            }
            auVar117 = vpcmpeqd_avx(auVar117,auVar117);
            auVar108 = vpcmpgtd_avx(stack0xffffffffffffa0d0,auVar117);
            auVar117 = vpcmpgtd_avx(local_5f40._0_16_,auVar117);
            auVar180 = ZEXT1664(auVar117);
            auVar117 = vpor_avx(auVar117,auVar108);
            if ((((auVar117 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar117 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar117 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar117[0xf]) {
              iVar91 = 3;
            }
            else {
              auVar118._8_4_ = 0xff800000;
              auVar118._0_8_ = 0xff800000ff800000;
              auVar118._12_4_ = 0xff800000;
              auVar118._16_4_ = 0xff800000;
              auVar118._20_4_ = 0xff800000;
              auVar118._24_4_ = 0xff800000;
              auVar118._28_4_ = 0xff800000;
              auVar180 = ZEXT3264(auVar118);
              local_5ba0 = vblendvps_avx(local_5ba0,auVar118,_local_5f40);
              iVar91 = 2;
            }
            auVar157 = ZEXT3264(local_6180);
            unaff_R14 = 0;
            if ((uint)uVar100 < (uint)POPCOUNT(uVar105)) goto LAB_01549091;
          }
LAB_015492ca:
        } while ((iVar91 == 4) || (iVar91 == 2));
LAB_0154ad0b:
        auVar135 = vandps_avx(local_5960,_local_5f40);
        auVar156._8_4_ = 0xff800000;
        auVar156._0_8_ = 0xff800000ff800000;
        auVar156._12_4_ = 0xff800000;
        auVar156._16_4_ = 0xff800000;
        auVar156._20_4_ = 0xff800000;
        auVar156._24_4_ = 0xff800000;
        auVar156._28_4_ = 0xff800000;
        auVar135 = vmaskmovps_avx(auVar135,auVar156);
        *(undefined1 (*) [32])local_5fd8 = auVar135;
        return;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }